

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_optimal_t *pZVar1;
  ZSTD_match_t *pZVar2;
  ZSTD_optimal_t *pZVar3;
  undefined8 uVar4;
  U32 UVar5;
  uint uVar6;
  U32 UVar7;
  U32 UVar8;
  U32 UVar9;
  U32 UVar10;
  BYTE *op;
  ulong *puVar11;
  ulong *puVar12;
  long lVar13;
  ulong uVar14;
  ZSTD_optimal_t *pZVar15;
  long lVar16;
  seqDef *psVar17;
  ulong *puVar18;
  ulong *puVar19;
  U32 UVar20;
  uint uVar21;
  uint uVar22;
  uint *puVar23;
  uint *puVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ulong *puVar28;
  ulong *puVar29;
  BYTE *pBVar30;
  U32 *pUVar31;
  BYTE *base;
  BYTE *pBVar32;
  uint uVar33;
  BYTE *ip;
  seqStore_t *psVar34;
  uint uVar35;
  int iVar36;
  optState_t *poVar37;
  ulong *puVar38;
  ulong *puVar39;
  ulong uVar40;
  ulong *puVar41;
  ulong *puVar42;
  uint uVar43;
  BYTE *pStart_3;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  BYTE *pStart_9;
  ulong uVar47;
  BYTE *pStart_1;
  long lVar48;
  ulong uVar49;
  ulong *puVar50;
  uint uVar51;
  U32 *pUVar52;
  ulong uVar53;
  ulong uVar54;
  ulong *puVar55;
  BYTE *pStart_11;
  ulong *puVar56;
  U32 *pUVar57;
  bool bVar58;
  int iVar62;
  int iVar63;
  undefined1 auVar59 [16];
  int iVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar68;
  int iVar69;
  repcodes_t rVar70;
  BYTE *pInLoopLimit;
  U32 dummy32;
  U32 dummy32_1;
  uint *local_210;
  uint *local_208;
  uint *local_200;
  uint *local_1f8;
  uint *local_1e8;
  uint *local_1d8;
  ulong local_1c8;
  ulong local_1c0;
  uint *local_1b8;
  ulong local_1a8;
  uint *local_190;
  uint *local_180;
  uint *local_178;
  uint local_15c;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  U32 local_138;
  undefined8 local_130;
  undefined8 local_128;
  ulong *local_120;
  ulong *local_118;
  undefined8 local_110;
  U32 *local_108;
  undefined8 local_100;
  ulong local_f8;
  undefined8 local_f0;
  uint local_e4;
  ulong local_e0;
  optState_t *local_d8;
  ulong local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  uint local_b4;
  seqStore_t *local_b0;
  ulong *local_a8;
  undefined8 local_a0;
  U32 local_98;
  uint *local_90;
  ZSTD_optimal_t *local_88;
  undefined8 local_80;
  ulong local_78;
  U32 *local_70;
  ulong *local_68;
  uint local_5c;
  undefined1 local_58 [16];
  size_t local_40;
  ulong local_38;
  
  pBVar32 = (ms->window).base;
  local_108 = rep;
  local_b0 = seqStore;
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      (uVar25 = (ms->window).dictLimit, uVar25 == (ms->window).lowLimit)) &&
     ((0x400 < srcSize && (uVar6 = (int)src - (int)pBVar32, uVar25 == uVar6)))) {
    local_138 = rep[2];
    local_140 = *(ulong *)rep;
    local_d8 = &ms->opt;
    puVar56 = (ulong *)((long)src + (srcSize - 8));
    uVar25 = (ms->cParams).targetLength;
    if (0xffe < uVar25) {
      uVar25 = 0xfff;
    }
    local_90 = (uint *)CONCAT44(local_90._4_4_,uVar25);
    uVar25 = (ms->cParams).minMatch;
    pZVar2 = (ms->opt).matchTable;
    pZVar3 = (ms->opt).priceTable;
    ms->nextToUpdate3 = ms->nextToUpdate;
    local_40 = srcSize;
    ZSTD_rescaleFreqs(local_d8,(BYTE *)src,srcSize,2);
    local_a8 = (ulong *)src;
    puVar39 = (ulong *)((ulong)(pBVar32 + uVar6 == (BYTE *)src) + (long)src);
    local_118 = puVar56;
    psVar34 = local_b0;
    if (puVar39 < puVar56) {
      puVar11 = (ulong *)(local_40 + (long)src);
      uVar6 = (uint)(uVar25 != 3);
      uVar25 = uVar6 + 3;
      local_e0 = (ulong)(uVar6 + 2);
      puVar56 = (ulong *)((long)puVar11 - 7);
      puVar38 = (ulong *)((long)puVar11 - 3);
      puVar12 = (ulong *)((long)puVar11 + -1);
      local_70 = pZVar3->rep;
      local_80 = (ulong)(uVar6 + 5 & 0xfffffffc);
      lVar13 = (ulong)uVar25 - 2;
      auVar59._8_4_ = (int)lVar13;
      auVar59._0_8_ = lVar13;
      auVar59._12_4_ = (int)((ulong)lVar13 >> 0x20);
      local_88 = pZVar3 + 4;
      local_58 = auVar59 ^ _DAT_00526580;
LAB_0046c2ec:
      iVar36 = (int)puVar39;
      UVar20 = iVar36 - (int)src;
      pBVar32 = (ms->window).base;
      uVar6 = ms->nextToUpdate;
      uVar14 = (ulong)uVar6;
      if (pBVar32 + uVar14 <= puVar39) {
        local_e4 = CONCAT31(local_e4._1_3_,UVar20 == 0);
        local_128 = (ulong *)src;
        UVar8 = (ms->cParams).minMatch;
        uVar33 = iVar36 - (int)pBVar32;
        while (uVar6 < uVar33) {
          UVar7 = ZSTD_insertBt1(ms,pBVar32 + uVar14,(BYTE *)puVar11,UVar8,0);
          uVar6 = (int)uVar14 + UVar7;
          uVar14 = (ulong)uVar6;
        }
        ms->nextToUpdate = uVar33;
        local_148._4_4_ = (undefined4)((ulong)local_148 >> 0x20);
        if (UVar8 - 6 < 2) {
          uVar14 = (ulong)(UVar20 == 0);
          uVar6 = (ms->cParams).targetLength;
          if (0xffe < uVar6) {
            uVar6 = 0xfff;
          }
          pBVar32 = (ms->window).base;
          uVar35 = iVar36 - (int)pBVar32;
          uVar44 = 0;
          uVar53 = *puVar39 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
          pUVar31 = ms->chainTable;
          uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar33 = uVar35 - uVar26;
          if (uVar35 < uVar26) {
            uVar33 = 0;
          }
          UVar8 = (ms->window).lowLimit;
          uVar46 = UVar8 + (UVar8 == 0);
          uVar54 = (ulong)((uVar26 & uVar35) * 2);
          puVar24 = pUVar31 + uVar54;
          local_200 = pUVar31 + uVar54 + 1;
          UVar8 = (ms->window).dictLimit;
          local_158 = ms->hashTable;
          uVar21 = local_158[uVar53];
          iVar36 = uVar35 + 9;
          uVar22 = (ms->cParams).searchLog;
          local_148 = (ulong *)CONCAT44(local_148._4_4_,uVar22);
          uVar54 = uVar14 + 3;
          puVar18 = (ulong *)((long)puVar39 + 4);
          uVar47 = local_e0;
          do {
            uVar51 = (U32)local_140 - 1;
            if (uVar14 != 3) {
              uVar51 = *(uint *)((long)&local_140 + uVar14 * 4);
            }
            uVar40 = 0;
            if ((uVar51 - 1 < uVar35 - UVar8) &&
               ((uint)*puVar39 == *(uint *)((long)puVar39 - (ulong)uVar51))) {
              lVar13 = -(ulong)uVar51;
              puVar28 = (ulong *)((long)puVar18 + lVar13);
              puVar29 = puVar18;
              if (puVar18 < puVar56) {
                if (*puVar28 == *puVar18) {
                  lVar13 = lVar13 + 0xc;
                  lVar48 = 0;
                  do {
                    puVar29 = (ulong *)((long)puVar39 + lVar48 + 0xc);
                    if (puVar56 <= puVar29) {
                      puVar28 = (ulong *)((long)puVar39 + lVar48 + lVar13);
                      goto LAB_0046c854;
                    }
                    uVar40 = *(ulong *)((long)puVar39 + lVar48 + lVar13);
                    lVar48 = lVar48 + 8;
                  } while (uVar40 == *puVar29);
                  uVar40 = *puVar29 ^ uVar40;
                  uVar45 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar51 = ((uint)(uVar45 >> 3) & 0x1fffffff) + (int)lVar48;
                }
                else {
                  uVar45 = *puVar18 ^ *puVar28;
                  uVar40 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar51 = (uint)(uVar40 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_0046c854:
                if ((puVar29 < puVar38) && ((uint)*puVar28 == (uint)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 4);
                  puVar28 = (ulong *)((long)puVar28 + 4);
                }
                if ((puVar29 < puVar12) && ((short)*puVar28 == (short)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 2);
                  puVar28 = (ulong *)((long)puVar28 + 2);
                }
                if (puVar29 < puVar11) {
                  puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar29));
                }
                uVar51 = (int)puVar29 - (int)puVar18;
              }
              uVar40 = (ulong)(uVar51 + 4);
            }
            if (uVar47 < uVar40) {
              pZVar2[uVar44].off = (int)uVar14 - (uint)(UVar20 == 0);
              pZVar2[uVar44].len = (uint)uVar40;
              uVar51 = (int)uVar44 + 1;
              uVar44 = (ulong)uVar51;
              if ((uVar6 < (uint)uVar40) ||
                 (uVar47 = uVar40, (ulong *)((long)puVar39 + uVar40) == puVar11)) goto LAB_0046d774;
            }
            uVar51 = (uint)uVar44;
            uVar14 = uVar14 + 1;
          } while (uVar14 < uVar54);
          local_158[uVar53] = uVar35;
          if (uVar46 <= uVar21) {
            uVar6 = ~(-1 << ((byte)uVar22 & 0x1f));
            uVar14 = 0;
            uVar53 = 0;
            iVar62 = iVar36;
            do {
              uVar40 = (ulong)uVar21;
              uVar54 = uVar53;
              if (uVar14 < uVar53) {
                uVar54 = uVar14;
              }
              puVar18 = (ulong *)((long)puVar39 + uVar54);
              puVar28 = (ulong *)(pBVar32 + uVar54 + uVar40);
              puVar29 = puVar18;
              if (puVar18 < puVar56) {
                if (*puVar28 == *puVar18) {
                  lVar13 = 0;
                  do {
                    puVar29 = (ulong *)((long)puVar39 + lVar13 + uVar54 + 8);
                    if (puVar56 <= puVar29) {
                      puVar28 = (ulong *)(pBVar32 + uVar40 + uVar54 + lVar13 + 8);
                      goto LAB_0046c9fc;
                    }
                    lVar48 = lVar13 + uVar40 + uVar54 + 8;
                    lVar13 = lVar13 + 8;
                  } while (*(ulong *)(pBVar32 + lVar48) == *puVar29);
                  uVar49 = *puVar29 ^ *(ulong *)(pBVar32 + lVar48);
                  uVar45 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar45 = (uVar45 >> 3 & 0x1fffffff) + lVar13;
                }
                else {
                  uVar49 = *puVar18 ^ *puVar28;
                  uVar45 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar45 = uVar45 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0046c9fc:
                if ((puVar29 < puVar38) && ((uint)*puVar28 == (uint)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 4);
                  puVar28 = (ulong *)((long)puVar28 + 4);
                }
                if ((puVar29 < puVar12) && ((short)*puVar28 == (short)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 2);
                  puVar28 = (ulong *)((long)puVar28 + 2);
                }
                if (puVar29 < puVar11) {
                  puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar29));
                }
                uVar45 = (long)puVar29 - (long)puVar18;
              }
              uVar45 = uVar45 + uVar54;
              iVar36 = iVar62;
              if (uVar47 < uVar45) {
                iVar36 = uVar21 + (U32)uVar45;
                if (uVar45 <= iVar62 - uVar21) {
                  iVar36 = iVar62;
                }
                pZVar2[uVar44].off = (uVar35 + 2) - uVar21;
                pZVar2[uVar44].len = (U32)uVar45;
                uVar51 = (int)uVar44 + 1;
                uVar44 = (ulong)uVar51;
                if ((0x1000 < uVar45) ||
                   (uVar47 = uVar45, (ulong *)((long)puVar39 + uVar45) == puVar11)) break;
              }
              uVar51 = (uint)uVar44;
              puVar23 = pUVar31 + (uVar21 & uVar26) * 2;
              if (pBVar32[uVar45 + uVar40] < *(byte *)((long)puVar39 + uVar45)) {
                *puVar24 = uVar21;
                if (uVar21 <= uVar33) goto LAB_0046d701;
                puVar23 = puVar23 + 1;
                puVar24 = puVar23;
                uVar14 = uVar45;
                uVar45 = uVar53;
              }
              else {
                *local_200 = uVar21;
                local_200 = puVar23;
                if (uVar21 <= uVar33) goto LAB_0046d6f4;
              }
              bVar58 = uVar6 == 0;
              uVar6 = uVar6 - 1;
              if ((bVar58) || (uVar21 = *puVar23, uVar53 = uVar45, iVar62 = iVar36, uVar21 < uVar46)
                 ) break;
            } while( true );
          }
          goto LAB_0046cd9d;
        }
        if (UVar8 == 5) {
          uVar14 = (ulong)(UVar20 == 0);
          uVar6 = (ms->cParams).targetLength;
          if (0xffe < uVar6) {
            uVar6 = 0xfff;
          }
          pBVar32 = (ms->window).base;
          uVar35 = iVar36 - (int)pBVar32;
          uVar44 = 0;
          uVar53 = *puVar39 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
          pUVar31 = ms->chainTable;
          uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar26 = uVar35 - uVar33;
          if (uVar35 < uVar33) {
            uVar26 = 0;
          }
          UVar8 = (ms->window).lowLimit;
          uVar46 = UVar8 + (UVar8 == 0);
          uVar54 = (ulong)((uVar33 & uVar35) * 2);
          puVar24 = pUVar31 + uVar54;
          local_200 = pUVar31 + uVar54 + 1;
          UVar8 = (ms->window).dictLimit;
          local_158 = ms->hashTable;
          uVar21 = local_158[uVar53];
          iVar36 = uVar35 + 9;
          uVar22 = (ms->cParams).searchLog;
          local_148 = (ulong *)CONCAT44(local_148._4_4_,uVar22);
          uVar54 = uVar14 + 3;
          puVar18 = (ulong *)((long)puVar39 + 4);
          uVar47 = local_e0;
          do {
            uVar51 = (U32)local_140 - 1;
            if (uVar14 != 3) {
              uVar51 = *(uint *)((long)&local_140 + uVar14 * 4);
            }
            uVar40 = 0;
            if ((uVar51 - 1 < uVar35 - UVar8) &&
               ((uint)*puVar39 == *(uint *)((long)puVar39 - (ulong)uVar51))) {
              lVar13 = -(ulong)uVar51;
              puVar28 = (ulong *)((long)puVar18 + lVar13);
              puVar29 = puVar18;
              if (puVar18 < puVar56) {
                if (*puVar28 == *puVar18) {
                  lVar13 = lVar13 + 0xc;
                  lVar48 = 0;
                  do {
                    puVar29 = (ulong *)((long)puVar39 + lVar48 + 0xc);
                    if (puVar56 <= puVar29) {
                      puVar28 = (ulong *)((long)puVar39 + lVar48 + lVar13);
                      goto LAB_0046cccd;
                    }
                    uVar40 = *(ulong *)((long)puVar39 + lVar48 + lVar13);
                    lVar48 = lVar48 + 8;
                  } while (uVar40 == *puVar29);
                  uVar40 = *puVar29 ^ uVar40;
                  uVar45 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar51 = ((uint)(uVar45 >> 3) & 0x1fffffff) + (int)lVar48;
                }
                else {
                  uVar45 = *puVar18 ^ *puVar28;
                  uVar40 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar51 = (uint)(uVar40 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_0046cccd:
                if ((puVar29 < puVar38) && ((uint)*puVar28 == (uint)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 4);
                  puVar28 = (ulong *)((long)puVar28 + 4);
                }
                if ((puVar29 < puVar12) && ((short)*puVar28 == (short)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 2);
                  puVar28 = (ulong *)((long)puVar28 + 2);
                }
                if (puVar29 < puVar11) {
                  puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar29));
                }
                uVar51 = (int)puVar29 - (int)puVar18;
              }
              uVar40 = (ulong)(uVar51 + 4);
            }
            if (uVar47 < uVar40) {
              pZVar2[uVar44].off = (int)uVar14 - (uint)(UVar20 == 0);
              pZVar2[uVar44].len = (uint)uVar40;
              uVar51 = (int)uVar44 + 1;
              uVar44 = (ulong)uVar51;
              if ((uVar6 < (uint)uVar40) ||
                 (uVar47 = uVar40, (ulong *)((long)puVar39 + uVar40) == puVar11)) goto LAB_0046d774;
            }
            uVar51 = (uint)uVar44;
            uVar14 = uVar14 + 1;
          } while (uVar14 < uVar54);
          local_158[uVar53] = uVar35;
          if (uVar46 <= uVar21) {
            uVar6 = ~(-1 << ((byte)uVar22 & 0x1f));
            uVar14 = 0;
            uVar53 = 0;
            iVar62 = iVar36;
            do {
              uVar40 = (ulong)uVar21;
              uVar54 = uVar53;
              if (uVar14 < uVar53) {
                uVar54 = uVar14;
              }
              puVar18 = (ulong *)((long)puVar39 + uVar54);
              puVar28 = (ulong *)(pBVar32 + uVar54 + uVar40);
              puVar29 = puVar18;
              if (puVar18 < puVar56) {
                if (*puVar28 == *puVar18) {
                  lVar13 = 0;
                  do {
                    puVar29 = (ulong *)((long)puVar39 + lVar13 + uVar54 + 8);
                    if (puVar56 <= puVar29) {
                      puVar28 = (ulong *)(pBVar32 + uVar40 + uVar54 + lVar13 + 8);
                      goto LAB_0046d15e;
                    }
                    lVar48 = lVar13 + uVar40 + uVar54 + 8;
                    lVar13 = lVar13 + 8;
                  } while (*(ulong *)(pBVar32 + lVar48) == *puVar29);
                  uVar49 = *puVar29 ^ *(ulong *)(pBVar32 + lVar48);
                  uVar45 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar45 = (uVar45 >> 3 & 0x1fffffff) + lVar13;
                }
                else {
                  uVar49 = *puVar18 ^ *puVar28;
                  uVar45 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar45 = uVar45 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0046d15e:
                if ((puVar29 < puVar38) && ((uint)*puVar28 == (uint)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 4);
                  puVar28 = (ulong *)((long)puVar28 + 4);
                }
                if ((puVar29 < puVar12) && ((short)*puVar28 == (short)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 2);
                  puVar28 = (ulong *)((long)puVar28 + 2);
                }
                if (puVar29 < puVar11) {
                  puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar29));
                }
                uVar45 = (long)puVar29 - (long)puVar18;
              }
              uVar45 = uVar45 + uVar54;
              iVar36 = iVar62;
              if (uVar47 < uVar45) {
                iVar36 = uVar21 + (U32)uVar45;
                if (uVar45 <= iVar62 - uVar21) {
                  iVar36 = iVar62;
                }
                pZVar2[uVar44].off = (uVar35 + 2) - uVar21;
                pZVar2[uVar44].len = (U32)uVar45;
                uVar51 = (int)uVar44 + 1;
                uVar44 = (ulong)uVar51;
                if ((0x1000 < uVar45) ||
                   (uVar47 = uVar45, (ulong *)((long)puVar39 + uVar45) == puVar11)) break;
              }
              uVar51 = (uint)uVar44;
              puVar23 = pUVar31 + (uVar21 & uVar33) * 2;
              if (pBVar32[uVar45 + uVar40] < *(byte *)((long)puVar39 + uVar45)) {
                *puVar24 = uVar21;
                if (uVar21 <= uVar26) goto LAB_0046d701;
                puVar23 = puVar23 + 1;
                puVar24 = puVar23;
                uVar14 = uVar45;
                uVar45 = uVar53;
              }
              else {
                *local_200 = uVar21;
                local_200 = puVar23;
                if (uVar21 <= uVar26) goto LAB_0046d6f4;
              }
              bVar58 = uVar6 == 0;
              uVar6 = uVar6 - 1;
              if ((bVar58) || (uVar21 = *puVar23, uVar53 = uVar45, iVar62 = iVar36, uVar21 < uVar46)
                 ) break;
            } while( true );
          }
          goto LAB_0046cd9d;
        }
        if (UVar8 == 3) {
          uVar14 = (ulong)(UVar20 == 0);
          uVar6 = (ms->cParams).targetLength;
          if (0xffe < uVar6) {
            uVar6 = 0xfff;
          }
          pBVar32 = (ms->window).base;
          uVar35 = iVar36 - (int)pBVar32;
          uVar53 = 0;
          local_158 = (uint *)(ulong)((uint)*puVar39 * -0x61c8864f >>
                                     (-(char)(ms->cParams).hashLog & 0x1fU));
          pUVar31 = ms->chainTable;
          uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar33 = uVar35 - uVar26;
          if (uVar35 < uVar26) {
            uVar33 = 0;
          }
          UVar8 = (ms->window).lowLimit;
          uVar21 = UVar8 + (UVar8 == 0);
          uVar44 = (ulong)((uVar26 & uVar35) * 2);
          local_180 = pUVar31 + uVar44;
          local_208 = pUVar31 + uVar44 + 1;
          UVar8 = (ms->window).dictLimit;
          local_148 = (ulong *)ms->hashTable;
          uVar22 = *(uint *)((long)local_148 + local_158 * 4);
          iVar36 = uVar35 + 9;
          local_130._4_4_ = (undefined4)((ulong)local_130 >> 0x20);
          local_130 = (U32 *)CONCAT44(local_130._4_4_,(ms->cParams).searchLog);
          uVar44 = uVar14 + 3;
          puVar18 = (ulong *)((long)puVar39 + 3);
          uVar54 = local_e0;
          do {
            uVar46 = (U32)local_140 - 1;
            if (uVar14 != 3) {
              uVar46 = *(uint *)((long)&local_140 + uVar14 * 4);
            }
            uVar47 = 0;
            if ((uVar46 - 1 < uVar35 - UVar8) &&
               (((*(uint *)((long)puVar39 - (ulong)uVar46) ^ (uint)*puVar39) & 0xffffff) == 0)) {
              lVar13 = -(ulong)uVar46;
              puVar28 = (ulong *)((long)puVar18 + lVar13);
              puVar29 = puVar18;
              if (puVar18 < puVar56) {
                if (*puVar28 == *puVar18) {
                  lVar13 = lVar13 + 0xb;
                  lVar48 = 0;
                  do {
                    puVar29 = (ulong *)((long)puVar39 + lVar48 + 0xb);
                    if (puVar56 <= puVar29) {
                      puVar28 = (ulong *)((long)puVar39 + lVar48 + lVar13);
                      goto LAB_0046c54f;
                    }
                    uVar47 = *(ulong *)((long)puVar39 + lVar48 + lVar13);
                    lVar48 = lVar48 + 8;
                  } while (uVar47 == *puVar29);
                  uVar47 = *puVar29 ^ uVar47;
                  uVar40 = 0;
                  if (uVar47 != 0) {
                    for (; (uVar47 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar46 = ((uint)(uVar40 >> 3) & 0x1fffffff) + (int)lVar48;
                }
                else {
                  uVar40 = *puVar18 ^ *puVar28;
                  uVar47 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                    }
                  }
                  uVar46 = (uint)(uVar47 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_0046c54f:
                if ((puVar29 < puVar38) && ((uint)*puVar28 == (uint)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 4);
                  puVar28 = (ulong *)((long)puVar28 + 4);
                }
                if ((puVar29 < puVar12) && ((short)*puVar28 == (short)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 2);
                  puVar28 = (ulong *)((long)puVar28 + 2);
                }
                if (puVar29 < puVar11) {
                  puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar29));
                }
                uVar46 = (int)puVar29 - (int)puVar18;
              }
              uVar47 = (ulong)(uVar46 + 3);
            }
            if (uVar54 < uVar47) {
              pZVar2[uVar53].off = (int)uVar14 - (uint)(UVar20 == 0);
              pZVar2[uVar53].len = (uint)uVar47;
              uVar51 = (int)uVar53 + 1;
              uVar53 = (ulong)uVar51;
              if ((uVar6 < (uint)uVar47) ||
                 (uVar54 = uVar47, (ulong *)((long)puVar39 + uVar47) == puVar11)) goto LAB_0046d774;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < uVar44);
          if (((uVar54 < 3) &&
              (UVar8 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar39), uVar21 <= UVar8)) &&
             (uVar35 - UVar8 < 0x40000)) {
            uVar14 = (ulong)UVar8;
            puVar28 = (ulong *)(pBVar32 + uVar14);
            puVar18 = puVar39;
            if (puVar39 < puVar56) {
              if (*puVar28 == *puVar39) {
                lVar13 = 0;
                do {
                  puVar18 = (ulong *)((long)puVar39 + lVar13 + 8);
                  if (puVar56 <= puVar18) {
                    puVar28 = (ulong *)(pBVar32 + lVar13 + uVar14 + 8);
                    puVar18 = (ulong *)((long)puVar39 + lVar13 + 8);
                    goto LAB_0046fba8;
                  }
                  lVar48 = lVar13 + uVar14 + 8;
                  uVar44 = *puVar18;
                  lVar13 = lVar13 + 8;
                } while (*(ulong *)(pBVar32 + lVar48) == uVar44);
                uVar44 = uVar44 ^ *(ulong *)(pBVar32 + lVar48);
                uVar14 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar13;
              }
              else {
                uVar44 = *puVar39 ^ *puVar28;
                uVar14 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                uVar14 = uVar14 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0046fba8:
              if ((puVar18 < puVar38) && ((uint)*puVar28 == (uint)*puVar18)) {
                puVar18 = (ulong *)((long)puVar18 + 4);
                puVar28 = (ulong *)((long)puVar28 + 4);
              }
              if ((puVar18 < puVar12) && ((short)*puVar28 == (short)*puVar18)) {
                puVar18 = (ulong *)((long)puVar18 + 2);
                puVar28 = (ulong *)((long)puVar28 + 2);
              }
              if (puVar18 < puVar11) {
                puVar18 = (ulong *)((long)puVar18 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar18));
              }
              uVar14 = (long)puVar18 - (long)puVar39;
            }
            if (uVar14 < 3) goto LAB_0046d02f;
            pZVar2->off = (uVar35 - UVar8) + 2;
            pZVar2->len = (U32)uVar14;
            if ((uVar14 <= uVar6) &&
               (uVar53 = 1, uVar54 = uVar14, (ulong *)((long)puVar39 + uVar14) != puVar11))
            goto LAB_0046d02f;
            UVar8 = uVar35 + 1;
            uVar51 = 1;
          }
          else {
LAB_0046d02f:
            uVar51 = (uint)uVar53;
            *(uint *)((long)local_148 + local_158 * 4) = uVar35;
            if (uVar21 <= uVar22) {
              uVar6 = ~(-1 << ((byte)local_130 & 0x1f));
              local_1c0 = 0;
              uVar14 = 0;
              do {
                uVar47 = (ulong)uVar22;
                uVar44 = uVar14;
                if (local_1c0 < uVar14) {
                  uVar44 = local_1c0;
                }
                puVar18 = (ulong *)((long)puVar39 + uVar44);
                puVar28 = (ulong *)(pBVar32 + uVar44 + uVar47);
                puVar29 = puVar18;
                if (puVar18 < puVar56) {
                  if (*puVar28 == *puVar18) {
                    lVar13 = 0;
                    do {
                      puVar29 = (ulong *)((long)puVar39 + lVar13 + uVar44 + 8);
                      if (puVar56 <= puVar29) {
                        puVar28 = (ulong *)(pBVar32 + uVar47 + uVar44 + lVar13 + 8);
                        goto LAB_0046d599;
                      }
                      lVar48 = lVar13 + uVar47 + uVar44 + 8;
                      lVar13 = lVar13 + 8;
                    } while (*(ulong *)(pBVar32 + lVar48) == *puVar29);
                    uVar45 = *puVar29 ^ *(ulong *)(pBVar32 + lVar48);
                    uVar40 = 0;
                    if (uVar45 != 0) {
                      for (; (uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar13;
                  }
                  else {
                    uVar45 = *puVar18 ^ *puVar28;
                    uVar40 = 0;
                    if (uVar45 != 0) {
                      for (; (uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    uVar40 = uVar40 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0046d599:
                  if ((puVar29 < puVar38) && ((uint)*puVar28 == (uint)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar28 = (ulong *)((long)puVar28 + 4);
                  }
                  if ((puVar29 < puVar12) && ((short)*puVar28 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar28 = (ulong *)((long)puVar28 + 2);
                  }
                  if (puVar29 < puVar11) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar29));
                  }
                  uVar40 = (long)puVar29 - (long)puVar18;
                }
                uVar40 = uVar40 + uVar44;
                if (uVar54 < uVar40) {
                  iVar62 = uVar22 + (U32)uVar40;
                  if (uVar40 <= iVar36 - uVar22) {
                    iVar62 = iVar36;
                  }
                  iVar36 = iVar62;
                  pZVar2[uVar53].off = (uVar35 + 2) - uVar22;
                  pZVar2[uVar53].len = (U32)uVar40;
                  uVar51 = (int)uVar53 + 1;
                  uVar53 = (ulong)uVar51;
                  if ((0x1000 < uVar40) ||
                     (uVar54 = uVar40, (ulong *)((long)puVar39 + uVar40) == puVar11)) break;
                }
                uVar51 = (uint)uVar53;
                puVar24 = pUVar31 + (uVar22 & uVar26) * 2;
                if (pBVar32[uVar40 + uVar47] < *(byte *)((long)puVar39 + uVar40)) {
                  *local_180 = uVar22;
                  if (uVar22 <= uVar33) {
                    local_180 = &local_15c;
                    break;
                  }
                  puVar24 = puVar24 + 1;
                  local_1c0 = uVar40;
                  local_180 = puVar24;
                }
                else {
                  *local_208 = uVar22;
                  uVar14 = uVar40;
                  local_208 = puVar24;
                  if (uVar22 <= uVar33) {
                    local_208 = &local_15c;
                    break;
                  }
                }
                bVar58 = uVar6 == 0;
                uVar6 = uVar6 - 1;
                if ((bVar58) || (uVar22 = *puVar24, uVar22 < uVar21)) break;
              } while( true );
            }
            *local_208 = 0;
            *local_180 = 0;
            UVar8 = iVar36 - 8;
          }
          ms->nextToUpdate = UVar8;
        }
        else {
          uVar14 = (ulong)(UVar20 == 0);
          uVar6 = (ms->cParams).targetLength;
          if (0xffe < uVar6) {
            uVar6 = 0xfff;
          }
          pBVar32 = (ms->window).base;
          uVar35 = iVar36 - (int)pBVar32;
          uVar53 = 0;
          uVar22 = (uint)*puVar39 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
          pUVar31 = ms->chainTable;
          uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar26 = uVar35 - uVar33;
          if (uVar35 < uVar33) {
            uVar26 = 0;
          }
          UVar8 = (ms->window).lowLimit;
          uVar43 = UVar8 + (UVar8 == 0);
          uVar44 = (ulong)((uVar33 & uVar35) * 2);
          puVar24 = pUVar31 + uVar44;
          local_200 = pUVar31 + uVar44 + 1;
          UVar8 = (ms->window).dictLimit;
          local_158 = ms->hashTable;
          uVar46 = local_158[uVar22];
          iVar36 = uVar35 + 9;
          uVar21 = (ms->cParams).searchLog;
          local_148 = (ulong *)CONCAT44(local_148._4_4_,uVar21);
          uVar44 = uVar14 + 3;
          puVar18 = (ulong *)((long)puVar39 + 4);
          uVar54 = local_e0;
          do {
            uVar51 = (U32)local_140 - 1;
            if (uVar14 != 3) {
              uVar51 = *(uint *)((long)&local_140 + uVar14 * 4);
            }
            uVar47 = 0;
            if ((uVar51 - 1 < uVar35 - UVar8) &&
               ((uint)*puVar39 == *(uint *)((long)puVar39 - (ulong)uVar51))) {
              lVar13 = -(ulong)uVar51;
              puVar28 = (ulong *)((long)puVar18 + lVar13);
              puVar29 = puVar18;
              if (puVar18 < puVar56) {
                if (*puVar28 == *puVar18) {
                  lVar13 = lVar13 + 0xc;
                  lVar48 = 0;
                  do {
                    puVar29 = (ulong *)((long)puVar39 + lVar48 + 0xc);
                    if (puVar56 <= puVar29) {
                      puVar28 = (ulong *)((long)puVar39 + lVar48 + lVar13);
                      goto LAB_0046cf4c;
                    }
                    uVar47 = *(ulong *)((long)puVar39 + lVar48 + lVar13);
                    lVar48 = lVar48 + 8;
                  } while (uVar47 == *puVar29);
                  uVar47 = *puVar29 ^ uVar47;
                  uVar40 = 0;
                  if (uVar47 != 0) {
                    for (; (uVar47 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar51 = ((uint)(uVar40 >> 3) & 0x1fffffff) + (int)lVar48;
                }
                else {
                  uVar40 = *puVar18 ^ *puVar28;
                  uVar47 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                    }
                  }
                  uVar51 = (uint)(uVar47 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_0046cf4c:
                if ((puVar29 < puVar38) && ((uint)*puVar28 == (uint)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 4);
                  puVar28 = (ulong *)((long)puVar28 + 4);
                }
                if ((puVar29 < puVar12) && ((short)*puVar28 == (short)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 2);
                  puVar28 = (ulong *)((long)puVar28 + 2);
                }
                if (puVar29 < puVar11) {
                  puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar29));
                }
                uVar51 = (int)puVar29 - (int)puVar18;
              }
              uVar47 = (ulong)(uVar51 + 4);
            }
            if (uVar54 < uVar47) {
              pZVar2[uVar53].off = (int)uVar14 - (uint)(UVar20 == 0);
              pZVar2[uVar53].len = (uint)uVar47;
              uVar51 = (int)uVar53 + 1;
              uVar53 = (ulong)uVar51;
              if ((uVar6 < (uint)uVar47) ||
                 (uVar54 = uVar47, (ulong *)((long)puVar39 + uVar47) == puVar11)) goto LAB_0046d774;
            }
            uVar51 = (uint)uVar53;
            uVar14 = uVar14 + 1;
          } while (uVar14 < uVar44);
          local_158[uVar22] = uVar35;
          if (uVar43 <= uVar46) {
            uVar6 = ~(-1 << ((byte)uVar21 & 0x1f));
            uVar14 = 0;
            uVar44 = 0;
            do {
              uVar40 = (ulong)uVar46;
              uVar47 = uVar44;
              if (uVar14 < uVar44) {
                uVar47 = uVar14;
              }
              puVar18 = (ulong *)((long)puVar39 + uVar47);
              puVar28 = (ulong *)(pBVar32 + uVar47 + uVar40);
              puVar29 = puVar18;
              if (puVar18 < puVar56) {
                if (*puVar28 == *puVar18) {
                  lVar13 = 0;
                  do {
                    puVar29 = (ulong *)((long)puVar39 + lVar13 + uVar47 + 8);
                    if (puVar56 <= puVar29) {
                      puVar28 = (ulong *)(pBVar32 + uVar40 + uVar47 + lVar13 + 8);
                      goto LAB_0046d37c;
                    }
                    lVar48 = lVar13 + uVar40 + uVar47 + 8;
                    lVar13 = lVar13 + 8;
                  } while (*(ulong *)(pBVar32 + lVar48) == *puVar29);
                  uVar49 = *puVar29 ^ *(ulong *)(pBVar32 + lVar48);
                  uVar45 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar45 = (uVar45 >> 3 & 0x1fffffff) + lVar13;
                }
                else {
                  uVar49 = *puVar18 ^ *puVar28;
                  uVar45 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar45 = uVar45 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0046d37c:
                if ((puVar29 < puVar38) && ((uint)*puVar28 == (uint)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 4);
                  puVar28 = (ulong *)((long)puVar28 + 4);
                }
                if ((puVar29 < puVar12) && ((short)*puVar28 == (short)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 2);
                  puVar28 = (ulong *)((long)puVar28 + 2);
                }
                if (puVar29 < puVar11) {
                  puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar29));
                }
                uVar45 = (long)puVar29 - (long)puVar18;
              }
              uVar45 = uVar45 + uVar47;
              if (uVar54 < uVar45) {
                iVar62 = uVar46 + (U32)uVar45;
                if (uVar45 <= iVar36 - uVar46) {
                  iVar62 = iVar36;
                }
                iVar36 = iVar62;
                pZVar2[uVar53].off = (uVar35 + 2) - uVar46;
                pZVar2[uVar53].len = (U32)uVar45;
                uVar51 = (int)uVar53 + 1;
                uVar53 = (ulong)uVar51;
                if ((0x1000 < uVar45) ||
                   (uVar54 = uVar45, (ulong *)((long)puVar39 + uVar45) == puVar11)) break;
              }
              uVar51 = (uint)uVar53;
              puVar23 = pUVar31 + (uVar46 & uVar33) * 2;
              if (pBVar32[uVar45 + uVar40] < *(byte *)((long)puVar39 + uVar45)) {
                *puVar24 = uVar46;
                if (uVar46 <= uVar26) {
                  puVar24 = &local_15c;
                  break;
                }
                puVar23 = puVar23 + 1;
                puVar24 = puVar23;
                uVar14 = uVar45;
                uVar45 = uVar44;
              }
              else {
                *local_200 = uVar46;
                local_200 = puVar23;
                if (uVar46 <= uVar26) {
                  local_200 = &local_15c;
                  break;
                }
              }
              bVar58 = uVar6 == 0;
              uVar6 = uVar6 - 1;
              if ((bVar58) || (uVar46 = *puVar23, uVar44 = uVar45, uVar46 < uVar43)) break;
            } while( true );
          }
          *local_200 = 0;
          *puVar24 = 0;
          ms->nextToUpdate = iVar36 - 8;
        }
        goto LAB_0046d774;
      }
      goto LAB_0046d819;
    }
LAB_0046fc42:
    ZSTD_resetSeqStore(psVar34);
    puVar24 = (ms->opt).litFreq;
    pBVar32 = (ms->window).base + -local_40;
    (ms->window).base = pBVar32;
    UVar20 = (ms->window).dictLimit + (int)local_40;
    (ms->window).dictLimit = UVar20;
    (ms->window).lowLimit = UVar20;
    ms->nextToUpdate = UVar20;
    ms->nextToUpdate3 = UVar20;
    iVar36 = 0;
    iVar62 = 0;
    iVar63 = 0;
    iVar64 = 0;
    lVar13 = 0;
    do {
      puVar23 = puVar24 + lVar13;
      uVar25 = *puVar23 * 0x10 - 1;
      uVar6 = puVar23[1] * 0x10 - 1;
      uVar33 = puVar23[2] * 0x10 - 1;
      uVar26 = puVar23[3] * 0x10 - 1;
      puVar23 = puVar24 + lVar13;
      *puVar23 = uVar25;
      puVar23[1] = uVar6;
      puVar23[2] = uVar33;
      puVar23[3] = uVar26;
      iVar36 = iVar36 + uVar25;
      iVar62 = iVar62 + uVar6;
      iVar63 = iVar63 + uVar33;
      iVar64 = iVar64 + uVar26;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x100);
    (ms->opt).litSum = iVar64 + iVar62 + iVar63 + iVar36;
    puVar24 = (ms->opt).litLengthFreq;
    iVar36 = 0;
    iVar62 = 0;
    iVar63 = 0;
    iVar64 = 0;
    lVar13 = 0;
    do {
      puVar23 = puVar24 + lVar13;
      uVar25 = *puVar23 * 0x10 - 1;
      uVar6 = puVar23[1] * 0x10 - 1;
      uVar33 = puVar23[2] * 0x10 - 1;
      uVar26 = puVar23[3] * 0x10 - 1;
      puVar23 = puVar24 + lVar13;
      *puVar23 = uVar25;
      puVar23[1] = uVar6;
      puVar23[2] = uVar33;
      puVar23[3] = uVar26;
      iVar36 = iVar36 + uVar25;
      iVar62 = iVar62 + uVar6;
      iVar63 = iVar63 + uVar33;
      iVar64 = iVar64 + uVar26;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x24);
    (ms->opt).litLengthSum = iVar64 + iVar62 + iVar63 + iVar36;
    puVar24 = (ms->opt).matchLengthFreq;
    lVar13 = 0;
    UVar20 = 0;
    do {
      iVar36 = puVar24[lVar13] * 0x10;
      puVar24[lVar13] = iVar36 - 1;
      UVar20 = (UVar20 + iVar36) - 1;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x35);
    (ms->opt).matchLengthSum = UVar20;
    puVar24 = (ms->opt).offCodeFreq;
    iVar36 = 0;
    iVar62 = 0;
    iVar63 = 0;
    iVar64 = 0;
    lVar13 = 0;
    do {
      puVar23 = puVar24 + lVar13;
      uVar25 = *puVar23 * 0x10 - 1;
      uVar6 = puVar23[1] * 0x10 - 1;
      uVar33 = puVar23[2] * 0x10 - 1;
      uVar26 = puVar23[3] * 0x10 - 1;
      puVar23 = puVar24 + lVar13;
      *puVar23 = uVar25;
      puVar23[1] = uVar6;
      puVar23[2] = uVar33;
      puVar23[3] = uVar26;
      iVar36 = iVar36 + uVar25;
      iVar62 = iVar62 + uVar6;
      iVar63 = iVar63 + uVar33;
      iVar64 = iVar64 + uVar26;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x20);
    (ms->opt).offCodeSum = iVar64 + iVar62 + iVar63 + iVar36;
    srcSize = local_40;
    src = local_a8;
  }
  local_d8 = &ms->opt;
  puVar56 = (ulong *)(srcSize + (long)src);
  puVar39 = (ulong *)((long)src + (srcSize - 8));
  uVar25 = (ms->window).dictLimit;
  local_b4 = (ms->cParams).targetLength;
  if (0xffe < local_b4) {
    local_b4 = 0xfff;
  }
  uVar6 = (ms->cParams).minMatch;
  pZVar3 = (ms->opt).priceTable;
  pZVar2 = (ms->opt).matchTable;
  ms->nextToUpdate3 = ms->nextToUpdate;
  ZSTD_rescaleFreqs(local_d8,(BYTE *)src,srcSize,2);
  puVar38 = (ulong *)((ulong)(pBVar32 + uVar25 == (BYTE *)src) + (long)src);
  if (puVar39 <= puVar38) {
LAB_004734cd:
    return (long)puVar56 - (long)src;
  }
  uVar25 = (uint)(uVar6 != 3);
  uVar6 = uVar25 + 3;
  local_148 = (ulong *)(ulong)(uVar25 + 2);
  puVar11 = (ulong *)((long)puVar56 - 7);
  puVar12 = (ulong *)((long)puVar56 - 3);
  local_118 = (ulong *)((long)puVar56 + -1);
  local_d0 = (ulong)(uVar25 + 5 & 0xfffffffc);
  lVar13 = (ulong)uVar6 - 2;
  auVar60._8_4_ = (int)lVar13;
  auVar60._0_8_ = lVar13;
  auVar60._12_4_ = (int)((ulong)lVar13 >> 0x20);
  local_c0 = pZVar3 + 4;
  local_88 = pZVar3 + 1;
  local_58 = auVar60 ^ _DAT_00526580;
LAB_0046fe9e:
  iVar36 = (int)puVar38;
  UVar20 = iVar36 - (int)src;
  pBVar32 = (ms->window).base;
  uVar25 = ms->nextToUpdate;
  uVar14 = (ulong)uVar25;
  if (pBVar32 + uVar14 <= puVar38) {
    local_e4 = CONCAT31(local_e4._1_3_,UVar20 == 0);
    UVar8 = (ms->cParams).minMatch;
    uVar33 = iVar36 - (int)pBVar32;
    local_a8 = (ulong *)src;
    while (uVar25 < uVar33) {
      UVar7 = ZSTD_insertBt1(ms,pBVar32 + uVar14,(BYTE *)puVar56,UVar8,0);
      uVar25 = (int)uVar14 + UVar7;
      uVar14 = (ulong)uVar25;
    }
    ms->nextToUpdate = uVar33;
    local_128._4_4_ = (undefined4)((ulong)local_128 >> 0x20);
    if (UVar8 - 6 < 2) {
      uVar14 = (ulong)(UVar20 == 0);
      uVar25 = (ms->cParams).targetLength;
      if (0xffe < uVar25) {
        uVar25 = 0xfff;
      }
      pBVar32 = (ms->window).base;
      uVar35 = iVar36 - (int)pBVar32;
      uVar53 = *puVar38 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
      pUVar31 = ms->hashTable;
      uVar22 = 0;
      pUVar52 = ms->chainTable;
      uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar33 = uVar35 - uVar26;
      if (uVar35 < uVar26) {
        uVar33 = uVar22;
      }
      local_128 = (ulong *)CONCAT44(local_128._4_4_,uVar33);
      UVar8 = (ms->window).lowLimit;
      uVar51 = UVar8 + (UVar8 == 0);
      uVar44 = (ulong)((uVar26 & uVar35) * 2);
      local_178 = pUVar52 + uVar44;
      local_210 = pUVar52 + uVar44 + 1;
      UVar8 = (ms->window).dictLimit;
      uVar46 = pUVar31[uVar53];
      iVar36 = uVar35 + 9;
      uVar21 = (ms->cParams).searchLog;
      uVar44 = uVar14 + 3;
      puVar18 = (ulong *)((long)puVar38 + 4);
      puVar28 = local_148;
      do {
        if (uVar14 == 3) {
          UVar7 = *local_108 - 1;
        }
        else {
          UVar7 = local_108[uVar14];
        }
        puVar29 = (ulong *)0x0;
        if ((UVar7 - 1 < uVar35 - UVar8) &&
           ((uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)UVar7))) {
          lVar13 = -(ulong)UVar7;
          puVar29 = (ulong *)((long)puVar18 + lVar13);
          puVar19 = puVar18;
          if (puVar18 < puVar11) {
            if (*puVar29 == *puVar18) {
              lVar13 = lVar13 + 0xc;
              lVar48 = 0;
              do {
                puVar19 = (ulong *)((long)puVar38 + lVar48 + 0xc);
                if (puVar11 <= puVar19) {
                  puVar29 = (ulong *)((long)puVar38 + lVar48 + lVar13);
                  goto LAB_004703e5;
                }
                uVar54 = *(ulong *)((long)puVar38 + lVar48 + lVar13);
                lVar48 = lVar48 + 8;
              } while (uVar54 == *puVar19);
              uVar54 = *puVar19 ^ uVar54;
              uVar47 = 0;
              if (uVar54 != 0) {
                for (; (uVar54 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              uVar43 = ((uint)(uVar47 >> 3) & 0x1fffffff) + (int)lVar48;
            }
            else {
              uVar47 = *puVar18 ^ *puVar29;
              uVar54 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                }
              }
              uVar43 = (uint)(uVar54 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_004703e5:
            if ((puVar19 < puVar12) && ((uint)*puVar29 == (uint)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar19 < local_118) && ((short)*puVar29 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar19 < puVar56) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19));
            }
            uVar43 = (int)puVar19 - (int)puVar18;
          }
          puVar29 = (ulong *)(ulong)(uVar43 + 4);
        }
        if (puVar28 < puVar29) {
          pZVar2[uVar22].off = (int)uVar14 - (uint)(UVar20 == 0);
          pZVar2[uVar22].len = (uint)puVar29;
          uVar22 = uVar22 + 1;
          if ((uVar25 < (uint)puVar29) ||
             (puVar28 = puVar29, (ulong *)((long)puVar38 + (long)puVar29) == puVar56))
          goto LAB_00470bef;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar44);
      pUVar31[uVar53] = uVar35;
      if (uVar51 <= uVar46) {
        uVar25 = ~(-1 << ((byte)uVar21 & 0x1f));
        puVar29 = (ulong *)0x0;
        puVar18 = (ulong *)0x0;
        iVar62 = iVar36;
        do {
          puVar19 = puVar18;
          if (puVar29 < puVar18) {
            puVar19 = puVar29;
          }
          puVar42 = (ulong *)((long)puVar38 + (long)puVar19);
          puVar55 = (ulong *)(pBVar32 + uVar46 + (long)puVar19);
          puVar50 = puVar42;
          if (puVar42 < puVar11) {
            if (*puVar55 == *puVar42) {
              pBVar30 = (BYTE *)((ulong)uVar46 + (long)puVar19);
              lVar13 = 0;
              do {
                puVar50 = (ulong *)((BYTE *)((long)(puVar38 + 1) + (long)puVar19) + lVar13);
                if (puVar11 <= puVar50) {
                  puVar55 = (ulong *)(pBVar32 + 8 + lVar13 + (long)pBVar30);
                  goto LAB_00470578;
                }
                uVar14 = *(ulong *)(pBVar32 + 8 + (long)pBVar30 + lVar13);
                lVar13 = lVar13 + 8;
              } while (uVar14 == *puVar50);
              uVar14 = *puVar50 ^ uVar14;
              uVar53 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                }
              }
              uVar14 = (uVar53 >> 3 & 0x1fffffff) + lVar13;
            }
            else {
              uVar53 = *puVar42 ^ *puVar55;
              uVar14 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00470578:
            if ((puVar50 < puVar12) && ((uint)*puVar55 == (uint)*puVar50)) {
              puVar50 = (ulong *)((long)puVar50 + 4);
              puVar55 = (ulong *)((long)puVar55 + 4);
            }
            if ((puVar50 < local_118) && ((short)*puVar55 == (short)*puVar50)) {
              puVar50 = (ulong *)((long)puVar50 + 2);
              puVar55 = (ulong *)((long)puVar55 + 2);
            }
            if (puVar50 < puVar56) {
              puVar50 = (ulong *)((long)puVar50 + (ulong)((BYTE)*puVar55 == (BYTE)*puVar50));
            }
            uVar14 = (long)puVar50 - (long)puVar42;
          }
          puVar19 = (ulong *)(uVar14 + (long)puVar19);
          iVar36 = iVar62;
          if (puVar28 < puVar19) {
            iVar36 = uVar46 + (U32)puVar19;
            if (puVar19 <= (ulong *)(ulong)(iVar62 - uVar46)) {
              iVar36 = iVar62;
            }
            pZVar2[uVar22].off = (uVar35 + 2) - uVar46;
            pZVar2[uVar22].len = (U32)puVar19;
            uVar22 = uVar22 + 1;
            if (((ulong *)0x1000 < puVar19) ||
               (puVar28 = puVar19, (ulong *)((long)puVar38 + (long)puVar19) == puVar56)) break;
          }
          puVar24 = pUVar52 + (uVar46 & uVar26) * 2;
          if ((pBVar32 + uVar46)[(long)puVar19] < *(byte *)((long)puVar38 + (long)puVar19)) {
            *local_178 = uVar46;
            if (uVar46 <= uVar33) goto LAB_00473365;
            puVar24 = puVar24 + 1;
            puVar29 = puVar19;
            local_178 = puVar24;
          }
          else {
            *local_210 = uVar46;
            local_210 = puVar24;
            puVar18 = puVar19;
            if (uVar46 <= uVar33) goto LAB_00473358;
          }
          bVar58 = uVar25 == 0;
          uVar25 = uVar25 - 1;
          if ((bVar58) || (uVar46 = *puVar24, iVar62 = iVar36, uVar46 < uVar51)) break;
        } while( true );
      }
      goto LAB_0047090e;
    }
    if (UVar8 == 5) {
      uVar14 = (ulong)(UVar20 == 0);
      uVar25 = (ms->cParams).targetLength;
      if (0xffe < uVar25) {
        uVar25 = 0xfff;
      }
      pBVar32 = (ms->window).base;
      uVar35 = iVar36 - (int)pBVar32;
      uVar53 = *puVar38 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
      pUVar31 = ms->hashTable;
      uVar22 = 0;
      pUVar52 = ms->chainTable;
      uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar33 = uVar35 - uVar26;
      if (uVar35 < uVar26) {
        uVar33 = uVar22;
      }
      local_128 = (ulong *)CONCAT44(local_128._4_4_,uVar33);
      UVar8 = (ms->window).lowLimit;
      uVar51 = UVar8 + (UVar8 == 0);
      uVar44 = (ulong)((uVar26 & uVar35) * 2);
      local_178 = pUVar52 + uVar44;
      local_210 = pUVar52 + uVar44 + 1;
      UVar8 = (ms->window).dictLimit;
      uVar46 = pUVar31[uVar53];
      iVar36 = uVar35 + 9;
      uVar21 = (ms->cParams).searchLog;
      uVar44 = uVar14 + 3;
      puVar28 = (ulong *)((long)puVar38 + 4);
      puVar18 = local_148;
      do {
        if (uVar14 == 3) {
          UVar7 = *local_108 - 1;
        }
        else {
          UVar7 = local_108[uVar14];
        }
        puVar29 = (ulong *)0x0;
        if ((UVar7 - 1 < uVar35 - UVar8) &&
           ((uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)UVar7))) {
          lVar13 = -(ulong)UVar7;
          puVar29 = (ulong *)((long)puVar28 + lVar13);
          puVar19 = puVar28;
          if (puVar28 < puVar11) {
            if (*puVar29 == *puVar28) {
              lVar13 = lVar13 + 0xc;
              lVar48 = 0;
              do {
                puVar19 = (ulong *)((long)puVar38 + lVar48 + 0xc);
                if (puVar11 <= puVar19) {
                  puVar29 = (ulong *)((long)puVar38 + lVar48 + lVar13);
                  goto LAB_0047084c;
                }
                uVar54 = *(ulong *)((long)puVar38 + lVar48 + lVar13);
                lVar48 = lVar48 + 8;
              } while (uVar54 == *puVar19);
              uVar54 = *puVar19 ^ uVar54;
              uVar47 = 0;
              if (uVar54 != 0) {
                for (; (uVar54 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              uVar43 = ((uint)(uVar47 >> 3) & 0x1fffffff) + (int)lVar48;
            }
            else {
              uVar47 = *puVar28 ^ *puVar29;
              uVar54 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                }
              }
              uVar43 = (uint)(uVar54 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_0047084c:
            if ((puVar19 < puVar12) && ((uint)*puVar29 == (uint)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar19 < local_118) && ((short)*puVar29 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar19 < puVar56) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19));
            }
            uVar43 = (int)puVar19 - (int)puVar28;
          }
          puVar29 = (ulong *)(ulong)(uVar43 + 4);
        }
        if (puVar18 < puVar29) {
          pZVar2[uVar22].off = (int)uVar14 - (uint)(UVar20 == 0);
          pZVar2[uVar22].len = (uint)puVar29;
          uVar22 = uVar22 + 1;
          if ((uVar25 < (uint)puVar29) ||
             (puVar18 = puVar29, (ulong *)((long)puVar38 + (long)puVar29) == puVar56))
          goto LAB_00470bef;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar44);
      pUVar31[uVar53] = uVar35;
      if (uVar51 <= uVar46) {
        uVar25 = ~(-1 << ((byte)uVar21 & 0x1f));
        puVar29 = (ulong *)0x0;
        puVar28 = (ulong *)0x0;
        do {
          puVar19 = puVar28;
          if (puVar29 < puVar28) {
            puVar19 = puVar29;
          }
          puVar42 = (ulong *)((long)puVar38 + (long)puVar19);
          puVar55 = (ulong *)(pBVar32 + uVar46 + (long)puVar19);
          puVar50 = puVar42;
          if (puVar42 < puVar11) {
            if (*puVar55 == *puVar42) {
              pBVar30 = (BYTE *)((ulong)uVar46 + (long)puVar19);
              lVar13 = 0;
              do {
                puVar50 = (ulong *)((BYTE *)((long)(puVar38 + 1) + (long)puVar19) + lVar13);
                if (puVar11 <= puVar50) {
                  puVar55 = (ulong *)(pBVar32 + 8 + lVar13 + (long)pBVar30);
                  goto LAB_00472b27;
                }
                uVar14 = *(ulong *)(pBVar32 + 8 + (long)pBVar30 + lVar13);
                lVar13 = lVar13 + 8;
              } while (uVar14 == *puVar50);
              uVar14 = *puVar50 ^ uVar14;
              uVar53 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                }
              }
              uVar14 = (uVar53 >> 3 & 0x1fffffff) + lVar13;
            }
            else {
              uVar53 = *puVar42 ^ *puVar55;
              uVar14 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00472b27:
            if ((puVar50 < puVar12) && ((uint)*puVar55 == (uint)*puVar50)) {
              puVar50 = (ulong *)((long)puVar50 + 4);
              puVar55 = (ulong *)((long)puVar55 + 4);
            }
            if ((puVar50 < local_118) && ((short)*puVar55 == (short)*puVar50)) {
              puVar50 = (ulong *)((long)puVar50 + 2);
              puVar55 = (ulong *)((long)puVar55 + 2);
            }
            if (puVar50 < puVar56) {
              puVar50 = (ulong *)((long)puVar50 + (ulong)((BYTE)*puVar55 == (BYTE)*puVar50));
            }
            uVar14 = (long)puVar50 - (long)puVar42;
          }
          puVar19 = (ulong *)(uVar14 + (long)puVar19);
          if (puVar18 < puVar19) {
            iVar62 = uVar46 + (U32)puVar19;
            if (puVar19 <= (ulong *)(ulong)(iVar36 - uVar46)) {
              iVar62 = iVar36;
            }
            iVar36 = iVar62;
            pZVar2[uVar22].off = (uVar35 + 2) - uVar46;
            pZVar2[uVar22].len = (U32)puVar19;
            uVar22 = uVar22 + 1;
            if (((ulong *)0x1000 < puVar19) ||
               (puVar18 = puVar19, (ulong *)((long)puVar38 + (long)puVar19) == puVar56)) break;
          }
          puVar24 = pUVar52 + (uVar46 & uVar26) * 2;
          if ((pBVar32 + uVar46)[(long)puVar19] < *(byte *)((long)puVar38 + (long)puVar19)) {
            *local_178 = uVar46;
            if (uVar46 <= uVar33) goto LAB_00473365;
            puVar24 = puVar24 + 1;
            puVar29 = puVar19;
            local_178 = puVar24;
          }
          else {
            *local_210 = uVar46;
            local_210 = puVar24;
            puVar28 = puVar19;
            if (uVar46 <= uVar33) goto LAB_00473358;
          }
          bVar58 = uVar25 == 0;
          uVar25 = uVar25 - 1;
          if ((bVar58) || (uVar46 = *puVar24, uVar46 < uVar51)) break;
        } while( true );
      }
      goto LAB_0047090e;
    }
    if (UVar8 == 3) {
      uVar14 = (ulong)(uint)(UVar20 == 0);
      uVar25 = (ms->cParams).targetLength;
      if (0xffe < uVar25) {
        uVar25 = 0xfff;
      }
      pBVar32 = (ms->window).base;
      uVar35 = iVar36 - (int)pBVar32;
      uVar21 = (uint)*puVar38 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
      pUVar31 = ms->hashTable;
      uVar22 = 0;
      pUVar52 = ms->chainTable;
      uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar33 = uVar35 - uVar26;
      if (uVar35 < uVar26) {
        uVar33 = uVar22;
      }
      UVar8 = (ms->window).lowLimit;
      uVar51 = UVar8 + (UVar8 == 0);
      uVar53 = (ulong)((uVar26 & uVar35) * 2);
      local_178 = pUVar52 + uVar53;
      local_210 = pUVar52 + uVar53 + 1;
      UVar8 = (ms->window).dictLimit;
      uVar46 = pUVar31[uVar21];
      local_128 = (ulong *)CONCAT44(local_128._4_4_,uVar35 + 9);
      uVar53 = (ulong)local_158 >> 0x20;
      local_158 = (uint *)CONCAT44((int)uVar53,(ms->cParams).searchLog);
      uVar53 = uVar14 + 3;
      puVar18 = (ulong *)((long)puVar38 + 3);
      puVar28 = local_148;
      do {
        if (uVar14 == 3) {
          UVar7 = *local_108 - 1;
        }
        else {
          UVar7 = local_108[uVar14];
        }
        puVar29 = (ulong *)0x0;
        if ((UVar7 - 1 < uVar35 - UVar8) &&
           (((*(uint *)((long)puVar38 - (ulong)UVar7) ^ (uint)*puVar38) & 0xffffff) == 0)) {
          lVar13 = -(ulong)UVar7;
          puVar29 = (ulong *)((long)puVar18 + lVar13);
          puVar19 = puVar18;
          if (puVar18 < puVar11) {
            if (*puVar29 == *puVar18) {
              lVar13 = lVar13 + 0xb;
              lVar48 = 0;
              do {
                puVar19 = (ulong *)((long)puVar38 + lVar48 + 0xb);
                if (puVar11 <= puVar19) {
                  puVar29 = (ulong *)((long)puVar38 + lVar48 + lVar13);
                  goto LAB_004700f5;
                }
                uVar44 = *(ulong *)((long)puVar38 + lVar48 + lVar13);
                lVar48 = lVar48 + 8;
              } while (uVar44 == *puVar19);
              uVar44 = *puVar19 ^ uVar44;
              uVar54 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                }
              }
              uVar43 = ((uint)(uVar54 >> 3) & 0x1fffffff) + (int)lVar48;
            }
            else {
              uVar54 = *puVar18 ^ *puVar29;
              uVar44 = 0;
              if (uVar54 != 0) {
                for (; (uVar54 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              uVar43 = (uint)(uVar44 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_004700f5:
            if ((puVar19 < puVar12) && ((uint)*puVar29 == (uint)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar19 < local_118) && ((short)*puVar29 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar19 < puVar56) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19));
            }
            uVar43 = (int)puVar19 - (int)puVar18;
          }
          puVar29 = (ulong *)(ulong)(uVar43 + 3);
        }
        if (puVar28 < puVar29) {
          pZVar2[uVar22].off = (int)uVar14 - (uint)(UVar20 == 0);
          pZVar2[uVar22].len = (uint)puVar29;
          uVar22 = uVar22 + 1;
          if ((uVar25 < (uint)puVar29) ||
             (puVar28 = puVar29, (ulong *)((long)puVar38 + (long)puVar29) == puVar56))
          goto LAB_00470bef;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar53);
      if (((puVar28 < (ulong *)0x3) &&
          (UVar8 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar38), uVar51 <= UVar8)) &&
         (uVar35 - UVar8 < 0x40000)) {
        uVar14 = (ulong)UVar8;
        puVar29 = (ulong *)(pBVar32 + uVar14);
        puVar18 = puVar38;
        if (puVar38 < puVar11) {
          if (*puVar29 == *puVar38) {
            lVar13 = 0;
            do {
              puVar18 = (ulong *)((long)puVar38 + lVar13 + 8);
              if (puVar11 <= puVar18) {
                puVar29 = (ulong *)(pBVar32 + lVar13 + uVar14 + 8);
                puVar18 = (ulong *)((long)puVar38 + lVar13 + 8);
                goto LAB_00473436;
              }
              lVar48 = lVar13 + uVar14 + 8;
              uVar53 = *puVar18;
              lVar13 = lVar13 + 8;
            } while (*(ulong *)(pBVar32 + lVar48) == uVar53);
            uVar53 = uVar53 ^ *(ulong *)(pBVar32 + lVar48);
            uVar14 = 0;
            if (uVar53 != 0) {
              for (; (uVar53 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            puVar18 = (ulong *)((uVar14 >> 3 & 0x1fffffff) + lVar13);
          }
          else {
            uVar53 = *puVar38 ^ *puVar29;
            uVar14 = 0;
            if (uVar53 != 0) {
              for (; (uVar53 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            puVar18 = (ulong *)(uVar14 >> 3 & 0x1fffffff);
          }
        }
        else {
LAB_00473436:
          if ((puVar18 < puVar12) && ((uint)*puVar29 == (uint)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 4);
            puVar29 = (ulong *)((long)puVar29 + 4);
          }
          if ((puVar18 < local_118) && ((short)*puVar29 == (short)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 2);
            puVar29 = (ulong *)((long)puVar29 + 2);
          }
          if (puVar18 < puVar56) {
            puVar18 = (ulong *)((long)puVar18 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar18));
          }
          puVar18 = (ulong *)((long)puVar18 - (long)puVar38);
        }
        if (puVar18 < (ulong *)0x3) goto LAB_00470baa;
        pZVar2->off = (uVar35 - UVar8) + 2;
        pZVar2->len = (U32)puVar18;
        if ((puVar18 <= (ulong *)(ulong)uVar25) &&
           (uVar22 = 1, puVar28 = puVar18, (ulong *)((long)puVar38 + (long)puVar18) != puVar56))
        goto LAB_00470baa;
        UVar8 = uVar35 + 1;
        uVar22 = 1;
      }
      else {
LAB_00470baa:
        pUVar31[uVar21] = uVar35;
        iVar36 = (int)local_128;
        if (uVar51 <= uVar46) {
          uVar25 = ~(-1 << ((byte)local_158 & 0x1f));
          puVar29 = (ulong *)0x0;
          puVar18 = (ulong *)0x0;
          do {
            puVar19 = puVar18;
            if (puVar29 < puVar18) {
              puVar19 = puVar29;
            }
            puVar42 = (ulong *)((long)puVar38 + (long)puVar19);
            puVar55 = (ulong *)(pBVar32 + uVar46 + (long)puVar19);
            puVar50 = puVar42;
            if (puVar42 < puVar11) {
              local_128 = puVar18;
              if (*puVar55 == *puVar42) {
                pBVar30 = (BYTE *)((ulong)uVar46 + (long)puVar19);
                lVar13 = 0;
                do {
                  puVar50 = (ulong *)((BYTE *)((long)(puVar38 + 1) + (long)puVar19) + lVar13);
                  if (puVar11 <= puVar50) {
                    puVar55 = (ulong *)(pBVar32 + 8 + lVar13 + (long)pBVar30);
                    goto LAB_00472f7f;
                  }
                  uVar14 = *(ulong *)(pBVar32 + 8 + (long)pBVar30 + lVar13);
                  lVar13 = lVar13 + 8;
                } while (uVar14 == *puVar50);
                uVar14 = *puVar50 ^ uVar14;
                uVar53 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                  }
                }
                uVar14 = (uVar53 >> 3 & 0x1fffffff) + lVar13;
              }
              else {
                uVar53 = *puVar42 ^ *puVar55;
                uVar14 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                uVar14 = uVar14 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00472f7f:
              if ((puVar50 < puVar12) && ((uint)*puVar55 == (uint)*puVar50)) {
                puVar50 = (ulong *)((long)puVar50 + 4);
                puVar55 = (ulong *)((long)puVar55 + 4);
              }
              if ((puVar50 < local_118) && ((short)*puVar55 == (short)*puVar50)) {
                puVar50 = (ulong *)((long)puVar50 + 2);
                puVar55 = (ulong *)((long)puVar55 + 2);
              }
              if (puVar50 < puVar56) {
                puVar50 = (ulong *)((long)puVar50 + (ulong)((BYTE)*puVar55 == (BYTE)*puVar50));
              }
              uVar14 = (long)puVar50 - (long)puVar42;
            }
            puVar19 = (ulong *)(uVar14 + (long)puVar19);
            if (puVar28 < puVar19) {
              iVar62 = uVar46 + (U32)puVar19;
              if (puVar19 <= (ulong *)(ulong)(iVar36 - uVar46)) {
                iVar62 = iVar36;
              }
              iVar36 = iVar62;
              pZVar2[uVar22].off = (uVar35 + 2) - uVar46;
              pZVar2[uVar22].len = (U32)puVar19;
              uVar22 = uVar22 + 1;
              if (((ulong *)0x1000 < puVar19) ||
                 (puVar28 = puVar19, (ulong *)((long)puVar38 + (long)puVar19) == puVar56)) break;
            }
            puVar24 = pUVar52 + (uVar46 & uVar26) * 2;
            if ((pBVar32 + uVar46)[(long)puVar19] < *(byte *)((long)puVar38 + (long)puVar19)) {
              *local_178 = uVar46;
              if (uVar46 <= uVar33) {
                local_178 = (uint *)&local_140;
                break;
              }
              puVar24 = puVar24 + 1;
              puVar29 = puVar19;
              local_178 = puVar24;
            }
            else {
              *local_210 = uVar46;
              puVar18 = puVar19;
              local_210 = puVar24;
              if (uVar46 <= uVar33) {
                local_210 = (uint *)&local_140;
                break;
              }
            }
            bVar58 = uVar25 == 0;
            uVar25 = uVar25 - 1;
            if ((bVar58) || (uVar46 = *puVar24, uVar46 < uVar51)) break;
          } while( true );
        }
        *local_210 = 0;
        *local_178 = 0;
        UVar8 = iVar36 - 8;
      }
      ms->nextToUpdate = UVar8;
    }
    else {
      uVar14 = (ulong)(UVar20 == 0);
      uVar25 = (ms->cParams).targetLength;
      if (0xffe < uVar25) {
        uVar25 = 0xfff;
      }
      pBVar32 = (ms->window).base;
      uVar35 = iVar36 - (int)pBVar32;
      uVar21 = (uint)*puVar38 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
      pUVar31 = ms->hashTable;
      uVar22 = 0;
      pUVar52 = ms->chainTable;
      uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar33 = uVar35 - uVar26;
      if (uVar35 < uVar26) {
        uVar33 = uVar22;
      }
      local_128 = (ulong *)CONCAT44(local_128._4_4_,uVar33);
      UVar8 = (ms->window).lowLimit;
      uVar43 = UVar8 + (UVar8 == 0);
      uVar53 = (ulong)((uVar26 & uVar35) * 2);
      local_178 = pUVar52 + uVar53;
      local_210 = pUVar52 + uVar53 + 1;
      UVar8 = (ms->window).dictLimit;
      uVar51 = pUVar31[uVar21];
      iVar36 = uVar35 + 9;
      uVar46 = (ms->cParams).searchLog;
      uVar53 = uVar14 + 3;
      puVar18 = (ulong *)((long)puVar38 + 4);
      puVar28 = local_148;
      do {
        if (uVar14 == 3) {
          UVar7 = *local_108 - 1;
        }
        else {
          UVar7 = local_108[uVar14];
        }
        uVar27 = 0;
        if ((UVar7 - 1 < uVar35 - UVar8) &&
           (uVar27 = 0, (uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)UVar7))) {
          lVar13 = -(ulong)UVar7;
          puVar29 = (ulong *)((long)puVar18 + lVar13);
          puVar19 = puVar18;
          if (puVar18 < puVar11) {
            if (*puVar29 == *puVar18) {
              lVar13 = lVar13 + 0xc;
              lVar48 = 0;
              do {
                puVar19 = (ulong *)((long)puVar38 + lVar48 + 0xc);
                if (puVar11 <= puVar19) {
                  puVar29 = (ulong *)((long)puVar38 + lVar48 + lVar13);
                  goto LAB_00470aad;
                }
                uVar44 = *(ulong *)((long)puVar38 + lVar48 + lVar13);
                lVar48 = lVar48 + 8;
              } while (uVar44 == *puVar19);
              uVar44 = *puVar19 ^ uVar44;
              uVar54 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                }
              }
              uVar27 = ((uint)(uVar54 >> 3) & 0x1fffffff) + (int)lVar48;
            }
            else {
              uVar54 = *puVar18 ^ *puVar29;
              uVar44 = 0;
              if (uVar54 != 0) {
                for (; (uVar54 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              uVar27 = (uint)(uVar44 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_00470aad:
            if ((puVar19 < puVar12) && ((uint)*puVar29 == (uint)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar19 < local_118) && ((short)*puVar29 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar19 < puVar56) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19));
            }
            uVar27 = (int)puVar19 - (int)puVar18;
          }
          uVar27 = uVar27 + 4;
        }
        puVar29 = (ulong *)(ulong)uVar27;
        if (puVar28 < puVar29) {
          pZVar2[uVar22].off = (int)uVar14 - (uint)(UVar20 == 0);
          pZVar2[uVar22].len = uVar27;
          uVar22 = uVar22 + 1;
          if ((uVar25 < uVar27) ||
             (puVar28 = puVar29, (ulong *)((long)puVar38 + (long)puVar29) == puVar56))
          goto LAB_00470bef;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar53);
      pUVar31[uVar21] = uVar35;
      if (uVar43 <= uVar51) {
        uVar25 = ~(-1 << ((byte)uVar46 & 0x1f));
        puVar29 = (ulong *)0x0;
        puVar18 = (ulong *)0x0;
        do {
          puVar19 = puVar18;
          if (puVar29 < puVar18) {
            puVar19 = puVar29;
          }
          puVar42 = (ulong *)((long)puVar38 + (long)puVar19);
          puVar55 = (ulong *)(pBVar32 + uVar51 + (long)puVar19);
          puVar50 = puVar42;
          if (puVar42 < puVar11) {
            if (*puVar55 == *puVar42) {
              pBVar30 = (BYTE *)((ulong)uVar51 + (long)puVar19);
              lVar13 = 0;
              do {
                puVar50 = (ulong *)((BYTE *)((long)(puVar38 + 1) + (long)puVar19) + lVar13);
                if (puVar11 <= puVar50) {
                  puVar55 = (ulong *)(pBVar32 + 8 + lVar13 + (long)pBVar30);
                  goto LAB_00472d3c;
                }
                uVar14 = *(ulong *)(pBVar32 + 8 + (long)pBVar30 + lVar13);
                lVar13 = lVar13 + 8;
              } while (uVar14 == *puVar50);
              uVar14 = *puVar50 ^ uVar14;
              uVar53 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                }
              }
              uVar14 = (uVar53 >> 3 & 0x1fffffff) + lVar13;
            }
            else {
              uVar53 = *puVar42 ^ *puVar55;
              uVar14 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00472d3c:
            if ((puVar50 < puVar12) && ((uint)*puVar55 == (uint)*puVar50)) {
              puVar50 = (ulong *)((long)puVar50 + 4);
              puVar55 = (ulong *)((long)puVar55 + 4);
            }
            if ((puVar50 < local_118) && ((short)*puVar55 == (short)*puVar50)) {
              puVar50 = (ulong *)((long)puVar50 + 2);
              puVar55 = (ulong *)((long)puVar55 + 2);
            }
            if (puVar50 < puVar56) {
              puVar50 = (ulong *)((long)puVar50 + (ulong)((BYTE)*puVar55 == (BYTE)*puVar50));
            }
            uVar14 = (long)puVar50 - (long)puVar42;
          }
          puVar19 = (ulong *)(uVar14 + (long)puVar19);
          if (puVar28 < puVar19) {
            iVar62 = uVar51 + (U32)puVar19;
            if (puVar19 <= (ulong *)(ulong)(iVar36 - uVar51)) {
              iVar62 = iVar36;
            }
            iVar36 = iVar62;
            pZVar2[uVar22].off = (uVar35 + 2) - uVar51;
            pZVar2[uVar22].len = (U32)puVar19;
            uVar22 = uVar22 + 1;
            if (((ulong *)0x1000 < puVar19) ||
               (puVar28 = puVar19, (ulong *)((long)puVar38 + (long)puVar19) == puVar56)) break;
          }
          puVar24 = pUVar52 + (uVar51 & uVar26) * 2;
          if ((pBVar32 + uVar51)[(long)puVar19] < *(byte *)((long)puVar38 + (long)puVar19)) {
            *local_178 = uVar51;
            if (uVar51 <= uVar33) {
              local_178 = (uint *)&local_140;
              break;
            }
            puVar24 = puVar24 + 1;
            puVar29 = puVar19;
            local_178 = puVar24;
          }
          else {
            *local_210 = uVar51;
            local_210 = puVar24;
            puVar18 = puVar19;
            if (uVar51 <= uVar33) {
              local_210 = (uint *)&local_140;
              break;
            }
          }
          bVar58 = uVar25 == 0;
          uVar25 = uVar25 - 1;
          if ((bVar58) || (uVar51 = *puVar24, uVar51 < uVar43)) break;
        } while( true );
      }
      *local_210 = 0;
      *local_178 = 0;
      ms->nextToUpdate = iVar36 - 8;
    }
    goto LAB_00470bef;
  }
  goto LAB_00470c86;
LAB_0046d6f4:
  local_200 = &local_15c;
  goto LAB_0046cd9d;
LAB_0046d701:
  puVar24 = &local_15c;
LAB_0046cd9d:
  *local_200 = 0;
  *puVar24 = 0;
  ms->nextToUpdate = iVar36 - 8;
LAB_0046d774:
  poVar37 = local_d8;
  uVar6 = local_e4;
  src = local_128;
  psVar34 = local_b0;
  if (uVar51 == 0) {
LAB_0046d819:
    puVar39 = (ulong *)((long)puVar39 + 1);
    goto LAB_0046faf6;
  }
  local_70[2] = local_138;
  *(ulong *)local_70 = local_140;
  pZVar3->mlen = 0;
  pZVar3->litlen = UVar20;
  iVar36 = ZSTD_literalsContribution((BYTE *)local_128,UVar20,local_d8,2);
  pZVar3->price = iVar36;
  uVar33 = pZVar2[uVar51 - 1].len;
  if ((uint)local_90 < uVar33) {
    UVar7 = pZVar2[uVar51 - 1].off;
    uVar6 = 0;
    iVar36 = (int)local_f8;
  }
  else {
    UVar8 = ZSTD_litLengthPrice(0,poVar37,2);
    auVar61 = _DAT_00526580;
    auVar60 = _DAT_00526570;
    auVar59 = _DAT_00526560;
    uVar14 = 0;
    pZVar15 = local_88;
    do {
      auVar67._8_4_ = (int)uVar14;
      auVar67._0_8_ = uVar14;
      auVar67._12_4_ = (int)(uVar14 >> 0x20);
      auVar65 = (auVar67 | auVar60) ^ auVar61;
      if ((bool)(~(auVar65._4_4_ == local_58._4_4_ && (int)local_58._0_4_ < auVar65._0_4_ ||
                  (int)local_58._4_4_ < auVar65._4_4_) & 1)) {
        pZVar15[-3].price = 0x40000000;
      }
      if ((auVar65._12_4_ != local_58._12_4_ || auVar65._8_4_ <= (int)local_58._8_4_) &&
          auVar65._12_4_ <= (int)local_58._12_4_) {
        pZVar15[-2].price = 0x40000000;
      }
      auVar67 = (auVar67 | auVar59) ^ auVar61;
      iVar62 = auVar67._4_4_;
      if (iVar62 <= (int)local_58._4_4_ &&
          (iVar62 != local_58._4_4_ || auVar67._0_4_ <= (int)local_58._0_4_)) {
        pZVar15[-1].price = 0x40000000;
        pZVar15->price = 0x40000000;
      }
      uVar14 = uVar14 + 4;
      pZVar15 = pZVar15 + 4;
    } while (local_80 != uVar14);
    uVar53 = 0;
    uVar14 = (ulong)uVar25;
    do {
      UVar7 = pZVar2[uVar53].off;
      uVar33 = pZVar2[uVar53].len;
      rVar70 = ZSTD_updateRep((U32 *)&local_140,UVar7,uVar6 & 0xff);
      if ((uint)uVar14 <= uVar33) {
        uVar26 = 0x1f;
        if (UVar7 + 1 != 0) {
          for (; UVar7 + 1 >> uVar26 == 0; uVar26 = uVar26 - 1) {
          }
        }
        uVar35 = (uint)uVar14 * 0x100 - 0x200;
        do {
          UVar10 = (U32)uVar14;
          if ((ms->opt).priceType == zop_predef) {
            iVar62 = 0x1f;
            if (UVar10 - 2 != 0) {
              for (; UVar10 - 2 >> iVar62 == 0; iVar62 = iVar62 + -1) {
              }
            }
            iVar62 = (iVar62 + uVar26) * 0x100 + (uVar35 >> ((byte)iVar62 & 0x1f)) + 0x1000;
          }
          else {
            uVar21 = UVar10 - 3;
            uVar22 = (ms->opt).offCodeFreq[uVar26] + 1;
            iVar62 = 0x1f;
            if (uVar22 != 0) {
              for (; uVar22 >> iVar62 == 0; iVar62 = iVar62 + -1) {
              }
            }
            if (uVar21 < 0x80) {
              uVar21 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar21];
            }
            else {
              uVar46 = 0x1f;
              if (uVar21 != 0) {
                for (; uVar21 >> uVar46 == 0; uVar46 = uVar46 - 1) {
                }
              }
              uVar21 = (uVar46 ^ 0xffffffe0) + 0x44;
            }
            uVar46 = (ms->opt).matchLengthFreq[uVar21] + 1;
            iVar63 = 0x1f;
            if (uVar46 != 0) {
              for (; uVar46 >> iVar63 == 0; iVar63 = iVar63 + -1) {
              }
            }
            iVar62 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar22 * 0x100 >> ((byte)iVar62 & 0x1f)) +
                     (uVar46 * 0x100 >> ((byte)iVar63 & 0x1f)))) +
                     ((ML_bits[uVar21] + uVar26) - (iVar62 + iVar63)) * 0x100 + 0x33;
          }
          pZVar3[uVar14].mlen = UVar10;
          pZVar3[uVar14].off = UVar7;
          pZVar3[uVar14].litlen = UVar20;
          pZVar3[uVar14].price = iVar62 + UVar8 + iVar36;
          *(long *)pZVar3[uVar14].rep = rVar70.rep._0_8_;
          pZVar3[uVar14].rep[2] = rVar70.rep[2];
          uVar14 = (ulong)(UVar10 + 1);
          uVar35 = uVar35 + 0x100;
        } while (UVar10 + 1 <= uVar33);
      }
      uVar53 = uVar53 + 1;
    } while (uVar53 != uVar51);
    uVar6 = (int)uVar14 - 1;
    pUVar31 = (U32 *)(ulong)uVar6;
    if (uVar6 == 0) {
      pUVar52 = (U32 *)0x0;
    }
    else {
      local_68 = (ulong *)((long)puVar39 + 0xc);
      local_120 = puVar39 + 1;
      local_78 = (long)puVar39 + 0xb;
      pUVar57 = (U32 *)0x1;
      do {
        poVar37 = local_d8;
        iVar36 = (int)pUVar57;
        pZVar15 = pZVar3 + (iVar36 - 1U);
        UVar20 = 1;
        if (pZVar3[iVar36 - 1U].mlen == 0) {
          UVar20 = pZVar15->litlen + 1;
        }
        puVar18 = (ulong *)((long)puVar39 + (long)pUVar57);
        iVar62 = 0x600;
        if ((ms->opt).priceType != zop_predef) {
          uVar6 = (ms->opt).litFreq[*(byte *)((long)puVar18 + -1)] + 1;
          iVar62 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar62 == 0; iVar62 = iVar62 + -1) {
            }
          }
          iVar62 = (ms->opt).litSumBasePrice -
                   (iVar62 * 0x100 + (uVar6 * 0x100 >> ((byte)iVar62 & 0x1f)));
        }
        iVar63 = pZVar15->price;
        UVar8 = ZSTD_litLengthPrice(UVar20,local_d8,2);
        UVar7 = ZSTD_litLengthPrice(UVar20 - 1,poVar37,2);
        uVar33 = (UVar8 + iVar62 + iVar63) - UVar7;
        pZVar1 = pZVar3 + (long)pUVar57;
        uVar6 = pZVar3[(long)pUVar57].price;
        if ((int)uVar33 <= pZVar3[(long)pUVar57].price) {
          pZVar1->off = 0;
          pZVar1->mlen = 0;
          pZVar1->litlen = UVar20;
          pZVar1->price = uVar33;
          *(undefined8 *)pZVar1->rep = *(undefined8 *)pZVar15->rep;
          pZVar1->rep[2] = pZVar15->rep[2];
          uVar6 = uVar33;
        }
        if (puVar18 <= local_118) {
          pUVar52 = pUVar57;
          if (iVar36 == (int)pUVar31) break;
          UVar8 = pZVar1->mlen;
          UVar20 = 0;
          if (UVar8 == 0) {
            UVar20 = pZVar1->litlen;
          }
          local_e4 = uVar6;
          UVar7 = ZSTD_litLengthPrice(0,local_d8,2);
          pBVar32 = (ms->window).base;
          uVar6 = ms->nextToUpdate;
          uVar14 = (ulong)uVar6;
          if (pBVar32 + uVar14 <= puVar18) {
            local_c8 = pUVar31;
            local_b4 = CONCAT31(local_b4._1_3_,UVar8 != 0);
            local_f0 = (long)pUVar57 * 0x1c;
            UVar10 = (ms->cParams).minMatch;
            iVar62 = (int)puVar18;
            uVar33 = iVar62 - (int)pBVar32;
            pUVar31 = local_c8;
            while (local_c8 = pUVar31, uVar6 < uVar33) {
              UVar9 = ZSTD_insertBt1(ms,pBVar32 + uVar14,(BYTE *)puVar11,UVar10,0);
              uVar6 = (int)uVar14 + UVar9;
              uVar14 = (ulong)uVar6;
              pUVar31 = local_c8;
            }
            lVar13 = (long)local_68 + (long)pUVar57;
            local_158 = (uint *)((long)local_120 + (long)pUVar57);
            ms->nextToUpdate = uVar33;
            local_110._4_4_ = (undefined4)((ulong)local_110 >> 0x20);
            local_130._4_4_ = (undefined4)((ulong)local_130 >> 0x20);
            local_c0._4_4_ = (undefined4)((ulong)local_c0 >> 0x20);
            if (UVar10 - 6 < 2) {
              uVar14 = (ulong)(UVar8 != 0);
              uVar6 = (ms->cParams).targetLength;
              if (0xffe < uVar6) {
                uVar6 = 0xfff;
              }
              pBVar32 = (ms->window).base;
              uVar35 = iVar62 - (int)pBVar32;
              local_150 = ms->hashTable;
              uVar53 = 0;
              local_d0 = *puVar18 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
              local_148 = (ulong *)ms->chainTable;
              uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar26 = uVar35 - uVar33;
              if (uVar35 < uVar33) {
                uVar26 = 0;
              }
              local_110 = (U32 *)CONCAT44(local_110._4_4_,uVar26);
              UVar10 = (ms->window).lowLimit;
              uVar46 = UVar10 + (UVar10 == 0);
              local_130 = (U32 *)CONCAT44(local_130._4_4_,uVar33);
              uVar44 = (ulong)((uVar33 & uVar35) * 2);
              local_1b8 = (uint *)((long)local_148 + uVar44 * 4);
              local_190 = (uint *)((long)local_148 + (uVar44 + 1) * 4);
              UVar10 = (ms->window).dictLimit;
              uVar21 = local_150[local_d0];
              local_100 = (ulong)uVar35;
              iVar62 = uVar35 + 9;
              uVar22 = (ms->cParams).searchLog;
              local_c0 = (ZSTD_optimal_t *)CONCAT44(local_c0._4_4_,uVar22);
              uVar44 = uVar14 + 3;
              puVar28 = (ulong *)((long)puVar18 + 4);
              uVar54 = local_e0;
              do {
                if (uVar14 == 3) {
                  uVar51 = pZVar1->rep[0] - 1;
                }
                else {
                  uVar51 = pZVar1->rep[uVar14];
                }
                uVar43 = 0;
                if ((uVar51 - 1 < uVar35 - UVar10) &&
                   (uVar43 = 0, (uint)*puVar18 == *(uint *)((long)puVar18 - (ulong)uVar51))) {
                  lVar48 = -(ulong)uVar51;
                  puVar29 = (ulong *)((long)puVar28 + lVar48);
                  puVar19 = puVar28;
                  if (puVar28 < puVar56) {
                    if (*puVar29 == *puVar28) {
                      lVar48 = lVar48 + lVar13;
                      lVar16 = 0;
                      do {
                        puVar19 = (ulong *)(lVar13 + lVar16);
                        if (puVar56 <= puVar19) {
                          puVar29 = (ulong *)(lVar48 + lVar16);
                          goto LAB_0046e2c6;
                        }
                        uVar47 = *(ulong *)(lVar48 + lVar16);
                        lVar16 = lVar16 + 8;
                      } while (uVar47 == *puVar19);
                      uVar47 = *puVar19 ^ uVar47;
                      uVar40 = 0;
                      if (uVar47 != 0) {
                        for (; (uVar47 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar43 = ((uint)(uVar40 >> 3) & 0x1fffffff) + (int)lVar16;
                    }
                    else {
                      uVar40 = *puVar28 ^ *puVar29;
                      uVar47 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                        }
                      }
                      uVar43 = (uint)(uVar47 >> 3) & 0x1fffffff;
                    }
                  }
                  else {
LAB_0046e2c6:
                    if ((puVar19 < puVar38) && ((uint)*puVar29 == (uint)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar19 < puVar12) && ((short)*puVar29 == (short)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar19 < puVar11) {
                      puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19))
                      ;
                    }
                    uVar43 = (int)puVar19 - (int)puVar28;
                  }
                  uVar43 = uVar43 + 4;
                }
                uVar47 = (ulong)uVar43;
                if (uVar54 < uVar47) {
                  pZVar2[uVar53].off = (int)uVar14 - (uint)(UVar8 != 0);
                  pZVar2[uVar53].len = uVar43;
                  uVar51 = (int)uVar53 + 1;
                  uVar53 = (ulong)uVar51;
                  if ((uVar6 < uVar43) ||
                     (uVar54 = uVar47, (ulong *)((long)puVar18 + uVar47) == puVar11))
                  goto LAB_0046f407;
                }
                uVar51 = (uint)uVar53;
                uVar14 = uVar14 + 1;
              } while (uVar14 < uVar44);
              local_150[local_d0] = uVar35;
              if (uVar46 <= uVar21) {
                uVar6 = ~(-1 << ((byte)uVar22 & 0x1f));
                local_100 = (ulong)(uVar35 + 2);
                local_150 = (U32 *)(pBVar32 + 8);
                local_180 = (uint *)0x0;
                uVar14 = 0;
                do {
                  uVar44 = (ulong)uVar21;
                  puVar24 = (uint *)uVar14;
                  if (local_180 < uVar14) {
                    puVar24 = local_180;
                  }
                  puVar28 = (ulong *)((long)puVar18 + (long)puVar24);
                  puVar29 = (ulong *)(pBVar32 + (long)puVar24 + uVar44);
                  puVar19 = puVar28;
                  if (puVar28 < puVar56) {
                    if (*puVar29 == *puVar28) {
                      lVar13 = 0;
                      do {
                        puVar19 = (ulong *)((long)local_158 + lVar13 + (long)puVar24);
                        if (puVar56 <= puVar19) {
                          puVar29 = (ulong *)((long)local_150 + uVar44 + (long)puVar24 + lVar13);
                          goto LAB_0046ea23;
                        }
                        uVar47 = *(ulong *)((long)local_150 + lVar13 + uVar44 + (long)puVar24);
                        lVar13 = lVar13 + 8;
                      } while (uVar47 == *puVar19);
                      uVar47 = *puVar19 ^ uVar47;
                      uVar40 = 0;
                      if (uVar47 != 0) {
                        for (; (uVar47 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar47 = (uVar40 >> 3 & 0x1fffffff) + lVar13;
                    }
                    else {
                      uVar40 = *puVar28 ^ *puVar29;
                      uVar47 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                        }
                      }
                      uVar47 = uVar47 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0046ea23:
                    if ((puVar19 < puVar38) && ((uint)*puVar29 == (uint)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar19 < puVar12) && ((short)*puVar29 == (short)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar19 < puVar11) {
                      puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19))
                      ;
                    }
                    uVar47 = (long)puVar19 - (long)puVar28;
                  }
                  uVar47 = uVar47 + (long)puVar24;
                  if (uVar54 < uVar47) {
                    iVar63 = uVar21 + (U32)uVar47;
                    if (uVar47 <= iVar62 - uVar21) {
                      iVar63 = iVar62;
                    }
                    iVar62 = iVar63;
                    pZVar2[uVar53].off = (uVar35 + 2) - uVar21;
                    pZVar2[uVar53].len = (U32)uVar47;
                    uVar51 = (int)uVar53 + 1;
                    uVar53 = (ulong)uVar51;
                    if ((0x1000 < uVar47) ||
                       (uVar54 = uVar47, (ulong *)((long)puVar18 + uVar47) == puVar11)) break;
                  }
                  uVar51 = (uint)uVar53;
                  puVar24 = (uint *)((long)local_148 + (ulong)((uVar21 & uVar33) * 2) * 4);
                  if (pBVar32[uVar47 + uVar44] < *(byte *)((long)puVar18 + uVar47)) {
                    *local_1b8 = uVar21;
                    if (uVar21 <= uVar26) {
                      local_1b8 = &local_15c;
                      break;
                    }
                    puVar24 = puVar24 + 1;
                    local_1b8 = puVar24;
                    local_180 = (uint *)uVar47;
                  }
                  else {
                    *local_190 = uVar21;
                    local_190 = puVar24;
                    uVar14 = uVar47;
                    if (uVar21 <= uVar26) {
                      local_190 = &local_15c;
                      break;
                    }
                  }
                  bVar58 = uVar6 == 0;
                  uVar6 = uVar6 - 1;
                  if ((bVar58) || (uVar21 = *puVar24, uVar21 < uVar46)) break;
                } while( true );
              }
              *local_190 = 0;
              *local_1b8 = 0;
              ms->nextToUpdate = iVar62 - 8;
            }
            else if (UVar10 == 5) {
              uVar14 = (ulong)(UVar8 != 0);
              uVar6 = (ms->cParams).targetLength;
              if (0xffe < uVar6) {
                uVar6 = 0xfff;
              }
              pBVar32 = (ms->window).base;
              uVar35 = iVar62 - (int)pBVar32;
              local_150 = ms->hashTable;
              uVar53 = 0;
              local_d0 = *puVar18 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
              local_148 = (ulong *)ms->chainTable;
              uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar26 = uVar35 - uVar33;
              if (uVar35 < uVar33) {
                uVar26 = 0;
              }
              local_110 = (U32 *)CONCAT44(local_110._4_4_,uVar26);
              UVar10 = (ms->window).lowLimit;
              uVar46 = UVar10 + (UVar10 == 0);
              local_130 = (U32 *)CONCAT44(local_130._4_4_,uVar33);
              uVar44 = (ulong)((uVar33 & uVar35) * 2);
              local_1b8 = (uint *)((long)local_148 + uVar44 * 4);
              local_190 = (uint *)((long)local_148 + (uVar44 + 1) * 4);
              UVar10 = (ms->window).dictLimit;
              uVar21 = local_150[local_d0];
              local_100 = (ulong)uVar35;
              iVar62 = uVar35 + 9;
              uVar22 = (ms->cParams).searchLog;
              local_c0 = (ZSTD_optimal_t *)CONCAT44(local_c0._4_4_,uVar22);
              uVar44 = uVar14 + 3;
              puVar28 = (ulong *)((long)puVar18 + 4);
              uVar54 = local_e0;
              do {
                if (uVar14 == 3) {
                  uVar51 = pZVar1->rep[0] - 1;
                }
                else {
                  uVar51 = pZVar1->rep[uVar14];
                }
                uVar47 = 0;
                if ((uVar51 - 1 < uVar35 - UVar10) &&
                   ((uint)*puVar18 == *(uint *)((long)puVar18 - (ulong)uVar51))) {
                  lVar48 = -(ulong)uVar51;
                  puVar29 = (ulong *)((long)puVar28 + lVar48);
                  puVar19 = puVar28;
                  if (puVar28 < puVar56) {
                    if (*puVar29 == *puVar28) {
                      lVar48 = lVar48 + lVar13;
                      lVar16 = 0;
                      do {
                        puVar19 = (ulong *)(lVar13 + lVar16);
                        if (puVar56 <= puVar19) {
                          puVar29 = (ulong *)(lVar48 + lVar16);
                          goto LAB_0046e575;
                        }
                        uVar47 = *(ulong *)(lVar48 + lVar16);
                        lVar16 = lVar16 + 8;
                      } while (uVar47 == *puVar19);
                      uVar47 = *puVar19 ^ uVar47;
                      uVar40 = 0;
                      if (uVar47 != 0) {
                        for (; (uVar47 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar51 = ((uint)(uVar40 >> 3) & 0x1fffffff) + (int)lVar16;
                    }
                    else {
                      uVar40 = *puVar28 ^ *puVar29;
                      uVar47 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                        }
                      }
                      uVar51 = (uint)(uVar47 >> 3) & 0x1fffffff;
                    }
                  }
                  else {
LAB_0046e575:
                    if ((puVar19 < puVar38) && ((uint)*puVar29 == (uint)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar19 < puVar12) && ((short)*puVar29 == (short)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar19 < puVar11) {
                      puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19))
                      ;
                    }
                    uVar51 = (int)puVar19 - (int)puVar28;
                  }
                  uVar47 = (ulong)(uVar51 + 4);
                }
                if (uVar54 < uVar47) {
                  pZVar2[uVar53].off = (int)uVar14 - (uint)(UVar8 != 0);
                  pZVar2[uVar53].len = (uint)uVar47;
                  uVar51 = (int)uVar53 + 1;
                  uVar53 = (ulong)uVar51;
                  if ((uVar6 < (uint)uVar47) ||
                     (uVar54 = uVar47, (ulong *)(uVar47 + (long)puVar18) == puVar11))
                  goto LAB_0046f407;
                }
                uVar51 = (uint)uVar53;
                uVar14 = uVar14 + 1;
              } while (uVar14 < uVar44);
              local_150[local_d0] = uVar35;
              if (uVar46 <= uVar21) {
                uVar6 = ~(-1 << ((byte)uVar22 & 0x1f));
                local_100 = (ulong)(uVar35 + 2);
                local_150 = (U32 *)(pBVar32 + 8);
                local_180 = (uint *)0x0;
                uVar14 = 0;
                do {
                  uVar44 = (ulong)uVar21;
                  puVar24 = (uint *)uVar14;
                  if (local_180 < uVar14) {
                    puVar24 = local_180;
                  }
                  puVar28 = (ulong *)((long)puVar18 + (long)puVar24);
                  puVar29 = (ulong *)(pBVar32 + (long)puVar24 + uVar44);
                  puVar19 = puVar28;
                  if (puVar28 < puVar56) {
                    if (*puVar29 == *puVar28) {
                      lVar13 = 0;
                      do {
                        puVar19 = (ulong *)((long)local_158 + lVar13 + (long)puVar24);
                        if (puVar56 <= puVar19) {
                          puVar29 = (ulong *)((long)local_150 + uVar44 + (long)puVar24 + lVar13);
                          goto LAB_0046ecce;
                        }
                        uVar47 = *(ulong *)((long)local_150 + lVar13 + uVar44 + (long)puVar24);
                        lVar13 = lVar13 + 8;
                      } while (uVar47 == *puVar19);
                      uVar47 = *puVar19 ^ uVar47;
                      uVar40 = 0;
                      if (uVar47 != 0) {
                        for (; (uVar47 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar47 = (uVar40 >> 3 & 0x1fffffff) + lVar13;
                    }
                    else {
                      uVar40 = *puVar28 ^ *puVar29;
                      uVar47 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                        }
                      }
                      uVar47 = uVar47 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0046ecce:
                    if ((puVar19 < puVar38) && ((uint)*puVar29 == (uint)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar19 < puVar12) && ((short)*puVar29 == (short)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar19 < puVar11) {
                      puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19))
                      ;
                    }
                    uVar47 = (long)puVar19 - (long)puVar28;
                  }
                  uVar47 = uVar47 + (long)puVar24;
                  if (uVar54 < uVar47) {
                    iVar63 = uVar21 + (U32)uVar47;
                    if (uVar47 <= iVar62 - uVar21) {
                      iVar63 = iVar62;
                    }
                    iVar62 = iVar63;
                    pZVar2[uVar53].off = (uVar35 + 2) - uVar21;
                    pZVar2[uVar53].len = (U32)uVar47;
                    uVar51 = (int)uVar53 + 1;
                    uVar53 = (ulong)uVar51;
                    if ((0x1000 < uVar47) ||
                       (uVar54 = uVar47, (ulong *)(uVar47 + (long)puVar18) == puVar11)) break;
                  }
                  uVar51 = (uint)uVar53;
                  puVar24 = (uint *)((long)local_148 + (ulong)((uVar21 & uVar33) * 2) * 4);
                  if (pBVar32[uVar47 + uVar44] < *(byte *)((long)puVar18 + uVar47)) {
                    *local_1b8 = uVar21;
                    if (uVar21 <= uVar26) {
                      local_1b8 = &local_15c;
                      break;
                    }
                    puVar24 = puVar24 + 1;
                    local_1b8 = puVar24;
                    local_180 = (uint *)uVar47;
                  }
                  else {
                    *local_190 = uVar21;
                    local_190 = puVar24;
                    uVar14 = uVar47;
                    if (uVar21 <= uVar26) {
                      local_190 = &local_15c;
                      break;
                    }
                  }
                  bVar58 = uVar6 == 0;
                  uVar6 = uVar6 - 1;
                  if ((bVar58) || (uVar21 = *puVar24, uVar21 < uVar46)) break;
                } while( true );
              }
              *local_190 = 0;
              *local_1b8 = 0;
              ms->nextToUpdate = iVar62 - 8;
            }
            else if (UVar10 == 3) {
              uVar14 = (ulong)(UVar8 != 0);
              uVar6 = (ms->cParams).targetLength;
              if (0xffe < uVar6) {
                uVar6 = 0xfff;
              }
              local_148 = (ulong *)(ms->window).base;
              uVar26 = iVar62 - (int)local_148;
              local_150 = (U32 *)(ulong)uVar26;
              uVar53 = 0;
              local_38 = (ulong)((uint)*puVar18 * -0x61c8864f >>
                                (-(char)(ms->cParams).hashLog & 0x1fU));
              local_130 = ms->chainTable;
              uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar62 = uVar26 - uVar33;
              if (uVar26 < uVar33) {
                iVar62 = 0;
              }
              local_100._4_4_ = (undefined4)(local_100 >> 0x20);
              local_100 = CONCAT44(local_100._4_4_,iVar62);
              UVar10 = (ms->window).lowLimit;
              uVar35 = UVar10 + (UVar10 == 0);
              local_110 = (U32 *)CONCAT44(local_110._4_4_,uVar33);
              uVar44 = (ulong)((uVar33 & uVar26) * 2);
              local_1d8 = local_130 + uVar44;
              local_1e8 = local_130 + uVar44 + 1;
              UVar10 = (ms->window).dictLimit;
              local_c0 = (ZSTD_optimal_t *)ms->hashTable;
              local_d0 = (ulong)ms->hashTable[local_38];
              iVar62 = uVar26 + 9;
              local_5c = (ms->cParams).searchLog;
              uVar44 = uVar14 + 3;
              puVar28 = (ulong *)((long)puVar18 + 3);
              local_180 = (uint *)local_e0;
              do {
                if (uVar14 == 3) {
                  UVar9 = pZVar1->rep[0] - 1;
                }
                else {
                  UVar9 = pZVar1->rep[uVar14];
                }
                uVar54 = 0;
                if ((UVar9 - 1 < uVar26 - UVar10) &&
                   (((*(uint *)((long)puVar18 - (ulong)UVar9) ^ (uint)*puVar18) & 0xffffff) == 0)) {
                  lVar13 = -(ulong)UVar9;
                  puVar29 = (ulong *)((long)puVar28 + lVar13);
                  puVar19 = puVar28;
                  if (puVar28 < puVar56) {
                    if (*puVar29 == *puVar28) {
                      lVar13 = lVar13 + local_78;
                      lVar48 = 0;
                      do {
                        puVar19 = (ulong *)((long)pUVar57 + lVar48 + local_78);
                        if (puVar56 <= puVar19) {
                          puVar29 = (ulong *)((long)pUVar57 + lVar48 + lVar13);
                          goto LAB_0046df4c;
                        }
                        uVar54 = *(ulong *)((long)pUVar57 + lVar48 + lVar13);
                        lVar48 = lVar48 + 8;
                      } while (uVar54 == *puVar19);
                      uVar54 = *puVar19 ^ uVar54;
                      uVar47 = 0;
                      if (uVar54 != 0) {
                        for (; (uVar54 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                        }
                      }
                      uVar33 = ((uint)(uVar47 >> 3) & 0x1fffffff) + (int)lVar48;
                    }
                    else {
                      uVar47 = *puVar28 ^ *puVar29;
                      uVar54 = 0;
                      if (uVar47 != 0) {
                        for (; (uVar47 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                        }
                      }
                      uVar33 = (uint)(uVar54 >> 3) & 0x1fffffff;
                    }
                  }
                  else {
LAB_0046df4c:
                    if ((puVar19 < puVar38) && ((uint)*puVar29 == (uint)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar19 < puVar12) && ((short)*puVar29 == (short)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar19 < puVar11) {
                      puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19))
                      ;
                    }
                    uVar33 = (int)puVar19 - (int)puVar28;
                  }
                  uVar54 = (ulong)(uVar33 + 3);
                }
                if (local_180 < uVar54) {
                  pZVar2[uVar53].off = (int)uVar14 - (uint)(UVar8 != 0);
                  pZVar2[uVar53].len = (uint)uVar54;
                  uVar51 = (int)uVar53 + 1;
                  uVar53 = (ulong)uVar51;
                  if ((uVar6 < (uint)uVar54) ||
                     (local_180 = (uint *)uVar54, (ulong *)(uVar54 + (long)puVar18) == puVar11))
                  goto LAB_0046f407;
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 < uVar44);
              if ((local_180 < 3) &&
                 (UVar8 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar18), uVar35 <= UVar8)) {
                UVar10 = (U32)local_150;
                if (0x3ffff < UVar10 - UVar8) goto LAB_0046eb9c;
                uVar14 = (ulong)UVar8;
                puVar28 = (ulong *)((long)local_148 + uVar14);
                puVar29 = puVar18;
                if (puVar18 < puVar56) {
                  if (*puVar28 == *puVar18) {
                    lVar13 = 0;
                    do {
                      puVar29 = (ulong *)((long)local_158 + lVar13);
                      if (puVar56 <= puVar29) {
                        puVar28 = (ulong *)((long)local_148 + lVar13 + uVar14 + 8);
                        goto LAB_0046f794;
                      }
                      uVar44 = *(ulong *)((long)local_148 + lVar13 + uVar14 + 8);
                      lVar13 = lVar13 + 8;
                    } while (uVar44 == *puVar29);
                    uVar44 = *puVar29 ^ uVar44;
                    uVar14 = 0;
                    if (uVar44 != 0) {
                      for (; (uVar44 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar13;
                  }
                  else {
                    uVar44 = *puVar18 ^ *puVar28;
                    uVar14 = 0;
                    if (uVar44 != 0) {
                      for (; (uVar44 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    uVar14 = uVar14 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0046f794:
                  if ((puVar29 < puVar38) && ((uint)*puVar28 == (uint)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar28 = (ulong *)((long)puVar28 + 4);
                  }
                  if ((puVar29 < puVar12) && ((short)*puVar28 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar28 = (ulong *)((long)puVar28 + 2);
                  }
                  if (puVar29 < puVar11) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar29));
                  }
                  uVar14 = (long)puVar29 - (long)puVar18;
                }
                if (uVar14 < 3) goto LAB_0046eb9c;
                pZVar2->off = (UVar10 - UVar8) + 2;
                pZVar2->len = (U32)uVar14;
                if ((uVar14 <= uVar6) &&
                   (uVar53 = 1, local_180 = (uint *)uVar14,
                   (ulong *)(uVar14 + (long)puVar18) != puVar11)) goto LAB_0046eb9c;
                UVar10 = UVar10 + 1;
                uVar51 = 1;
              }
              else {
                UVar10 = (U32)local_150;
LAB_0046eb9c:
                uVar51 = (uint)uVar53;
                *(U32 *)((long)local_c0 + local_38 * 4) = UVar10;
                if (uVar35 <= (uint)local_d0) {
                  uVar6 = ~(-1 << ((byte)local_5c & 0x1f));
                  local_150 = (U32 *)(ulong)(UVar10 + 2);
                  uVar44 = 0;
                  uVar14 = 0;
                  uVar54 = local_d0;
                  iVar63 = iVar62;
                  do {
                    uVar47 = uVar14;
                    if (uVar44 < uVar14) {
                      uVar47 = uVar44;
                    }
                    uVar33 = (uint)uVar54;
                    uVar54 = uVar54 & 0xffffffff;
                    puVar28 = (ulong *)((long)puVar18 + uVar47);
                    puVar29 = (ulong *)((long)local_148 + uVar47 + uVar54);
                    puVar19 = puVar28;
                    if (puVar28 < puVar56) {
                      if (*puVar29 == *puVar28) {
                        lVar13 = 0;
                        do {
                          puVar19 = (ulong *)((long)local_158 + lVar13 + uVar47);
                          if (puVar56 <= puVar19) {
                            puVar29 = (ulong *)((long)local_148 + uVar54 + uVar47 + lVar13 + 8);
                            goto LAB_0046f174;
                          }
                          uVar40 = *(ulong *)((long)local_148 + lVar13 + uVar54 + uVar47 + 8);
                          lVar13 = lVar13 + 8;
                        } while (uVar40 == *puVar19);
                        uVar40 = *puVar19 ^ uVar40;
                        uVar45 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                          }
                        }
                        uVar40 = (uVar45 >> 3 & 0x1fffffff) + lVar13;
                      }
                      else {
                        uVar45 = *puVar28 ^ *puVar29;
                        uVar40 = 0;
                        if (uVar45 != 0) {
                          for (; (uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        uVar40 = uVar40 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_0046f174:
                      if ((puVar19 < puVar38) && ((uint)*puVar29 == (uint)*puVar19)) {
                        puVar19 = (ulong *)((long)puVar19 + 4);
                        puVar29 = (ulong *)((long)puVar29 + 4);
                      }
                      if ((puVar19 < puVar12) && ((short)*puVar29 == (short)*puVar19)) {
                        puVar19 = (ulong *)((long)puVar19 + 2);
                        puVar29 = (ulong *)((long)puVar29 + 2);
                      }
                      if (puVar19 < puVar11) {
                        puVar19 = (ulong *)((long)puVar19 +
                                           (ulong)((BYTE)*puVar29 == (BYTE)*puVar19));
                      }
                      uVar40 = (long)puVar19 - (long)puVar28;
                    }
                    uVar40 = uVar40 + uVar47;
                    iVar62 = iVar63;
                    if (local_180 < uVar40) {
                      iVar62 = uVar33 + (U32)uVar40;
                      if (uVar40 <= iVar63 - uVar33) {
                        iVar62 = iVar63;
                      }
                      pZVar2[uVar53].off = (UVar10 + 2) - uVar33;
                      pZVar2[uVar53].len = (U32)uVar40;
                      uVar51 = (int)uVar53 + 1;
                      uVar53 = (ulong)uVar51;
                      if ((0x1000 < uVar40) ||
                         (local_180 = (uint *)uVar40, (ulong *)(uVar40 + (long)puVar18) == puVar11))
                      break;
                    }
                    uVar51 = (uint)uVar53;
                    puVar24 = local_130 + (uVar33 & (uint)local_110) * 2;
                    if (*(byte *)((long)local_148 + uVar40 + uVar54) <
                        *(byte *)((long)puVar18 + uVar40)) {
                      *local_1d8 = uVar33;
                      if (uVar33 <= (uint)local_100) {
                        local_1d8 = &local_15c;
                        break;
                      }
                      puVar24 = puVar24 + 1;
                      uVar44 = uVar40;
                      local_1d8 = puVar24;
                    }
                    else {
                      *local_1e8 = uVar33;
                      uVar14 = uVar40;
                      local_1e8 = puVar24;
                      if (uVar33 <= (uint)local_100) {
                        local_1e8 = &local_15c;
                        break;
                      }
                    }
                    bVar58 = uVar6 == 0;
                    uVar6 = uVar6 - 1;
                    if ((bVar58) || (uVar54 = (ulong)*puVar24, iVar63 = iVar62, *puVar24 < uVar35))
                    break;
                  } while( true );
                }
                *local_1e8 = 0;
                *local_1d8 = 0;
                UVar10 = iVar62 - 8;
              }
              ms->nextToUpdate = UVar10;
            }
            else {
              uVar14 = (ulong)(UVar8 != 0);
              uVar6 = (ms->cParams).targetLength;
              if (0xffe < uVar6) {
                uVar6 = 0xfff;
              }
              pBVar32 = (ms->window).base;
              uVar35 = iVar62 - (int)pBVar32;
              local_150 = ms->hashTable;
              uVar53 = 0;
              local_d0 = (ulong)((uint)*puVar18 * -0x61c8864f >>
                                (-(char)(ms->cParams).hashLog & 0x1fU));
              local_148 = (ulong *)ms->chainTable;
              uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar26 = uVar35 - uVar33;
              if (uVar35 < uVar33) {
                uVar26 = 0;
              }
              local_110 = (U32 *)CONCAT44(local_110._4_4_,uVar26);
              UVar10 = (ms->window).lowLimit;
              uVar46 = UVar10 + (UVar10 == 0);
              local_130 = (U32 *)CONCAT44(local_130._4_4_,uVar33);
              uVar44 = (ulong)((uVar33 & uVar35) * 2);
              local_1b8 = (uint *)((long)local_148 + uVar44 * 4);
              local_190 = (uint *)((long)local_148 + (uVar44 + 1) * 4);
              UVar10 = (ms->window).dictLimit;
              uVar21 = local_150[local_d0];
              local_100 = (ulong)uVar35;
              iVar62 = uVar35 + 9;
              uVar22 = (ms->cParams).searchLog;
              local_c0 = (ZSTD_optimal_t *)CONCAT44(local_c0._4_4_,uVar22);
              uVar44 = uVar14 + 3;
              puVar28 = (ulong *)((long)puVar18 + 4);
              uVar54 = local_e0;
              do {
                if (uVar14 == 3) {
                  uVar51 = pZVar1->rep[0] - 1;
                }
                else {
                  uVar51 = pZVar1->rep[uVar14];
                }
                uVar43 = 0;
                if ((uVar51 - 1 < uVar35 - UVar10) &&
                   (uVar43 = 0, (uint)*puVar18 == *(uint *)((long)puVar18 - (ulong)uVar51))) {
                  lVar48 = -(ulong)uVar51;
                  puVar29 = (ulong *)((long)puVar28 + lVar48);
                  puVar19 = puVar28;
                  if (puVar28 < puVar56) {
                    if (*puVar29 == *puVar28) {
                      lVar48 = lVar48 + lVar13;
                      lVar16 = 0;
                      do {
                        puVar19 = (ulong *)(lVar13 + lVar16);
                        if (puVar56 <= puVar19) {
                          puVar29 = (ulong *)(lVar48 + lVar16);
                          goto LAB_0046e824;
                        }
                        uVar47 = *(ulong *)(lVar48 + lVar16);
                        lVar16 = lVar16 + 8;
                      } while (uVar47 == *puVar19);
                      uVar47 = *puVar19 ^ uVar47;
                      uVar40 = 0;
                      if (uVar47 != 0) {
                        for (; (uVar47 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar43 = ((uint)(uVar40 >> 3) & 0x1fffffff) + (int)lVar16;
                    }
                    else {
                      uVar40 = *puVar28 ^ *puVar29;
                      uVar47 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                        }
                      }
                      uVar43 = (uint)(uVar47 >> 3) & 0x1fffffff;
                    }
                  }
                  else {
LAB_0046e824:
                    if ((puVar19 < puVar38) && ((uint)*puVar29 == (uint)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar19 < puVar12) && ((short)*puVar29 == (short)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar19 < puVar11) {
                      puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19))
                      ;
                    }
                    uVar43 = (int)puVar19 - (int)puVar28;
                  }
                  uVar43 = uVar43 + 4;
                }
                uVar47 = (ulong)uVar43;
                if (uVar54 < uVar47) {
                  pZVar2[uVar53].off = (int)uVar14 - (uint)(UVar8 != 0);
                  pZVar2[uVar53].len = uVar43;
                  uVar51 = (int)uVar53 + 1;
                  uVar53 = (ulong)uVar51;
                  if ((uVar6 < uVar43) ||
                     (uVar54 = uVar47, (ulong *)(uVar47 + (long)puVar18) == puVar11))
                  goto LAB_0046f407;
                }
                uVar51 = (uint)uVar53;
                uVar14 = uVar14 + 1;
              } while (uVar14 < uVar44);
              local_150[local_d0] = uVar35;
              if (uVar46 <= uVar21) {
                uVar6 = ~(-1 << ((byte)uVar22 & 0x1f));
                local_100 = (ulong)(uVar35 + 2);
                local_150 = (U32 *)(pBVar32 + 8);
                local_180 = (uint *)0x0;
                uVar14 = 0;
                do {
                  uVar44 = (ulong)uVar21;
                  puVar24 = (uint *)uVar14;
                  if (local_180 < uVar14) {
                    puVar24 = local_180;
                  }
                  puVar28 = (ulong *)((long)puVar18 + (long)puVar24);
                  puVar29 = (ulong *)(pBVar32 + (long)puVar24 + uVar44);
                  puVar19 = puVar28;
                  if (puVar28 < puVar56) {
                    if (*puVar29 == *puVar28) {
                      lVar13 = 0;
                      do {
                        puVar19 = (ulong *)((long)local_158 + lVar13 + (long)puVar24);
                        if (puVar56 <= puVar19) {
                          puVar29 = (ulong *)((long)local_150 + uVar44 + (long)puVar24 + lVar13);
                          goto LAB_0046ef20;
                        }
                        uVar47 = *(ulong *)((long)local_150 + lVar13 + uVar44 + (long)puVar24);
                        lVar13 = lVar13 + 8;
                      } while (uVar47 == *puVar19);
                      uVar47 = *puVar19 ^ uVar47;
                      uVar40 = 0;
                      if (uVar47 != 0) {
                        for (; (uVar47 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar47 = (uVar40 >> 3 & 0x1fffffff) + lVar13;
                    }
                    else {
                      uVar40 = *puVar28 ^ *puVar29;
                      uVar47 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                        }
                      }
                      uVar47 = uVar47 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0046ef20:
                    if ((puVar19 < puVar38) && ((uint)*puVar29 == (uint)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar19 < puVar12) && ((short)*puVar29 == (short)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar19 < puVar11) {
                      puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar19))
                      ;
                    }
                    uVar47 = (long)puVar19 - (long)puVar28;
                  }
                  uVar47 = uVar47 + (long)puVar24;
                  if (uVar54 < uVar47) {
                    iVar63 = uVar21 + (U32)uVar47;
                    if (uVar47 <= iVar62 - uVar21) {
                      iVar63 = iVar62;
                    }
                    iVar62 = iVar63;
                    pZVar2[uVar53].off = (uVar35 + 2) - uVar21;
                    pZVar2[uVar53].len = (U32)uVar47;
                    uVar51 = (int)uVar53 + 1;
                    uVar53 = (ulong)uVar51;
                    if ((0x1000 < uVar47) ||
                       (uVar54 = uVar47, (ulong *)(uVar47 + (long)puVar18) == puVar11)) break;
                  }
                  uVar51 = (uint)uVar53;
                  puVar24 = (uint *)((long)local_148 + (ulong)((uVar21 & uVar33) * 2) * 4);
                  if (pBVar32[uVar47 + uVar44] < *(byte *)((long)puVar18 + uVar47)) {
                    *local_1b8 = uVar21;
                    if (uVar21 <= uVar26) {
                      local_1b8 = &local_15c;
                      break;
                    }
                    puVar24 = puVar24 + 1;
                    local_1b8 = puVar24;
                    local_180 = (uint *)uVar47;
                  }
                  else {
                    *local_190 = uVar21;
                    local_190 = puVar24;
                    uVar14 = uVar47;
                    if (uVar21 <= uVar26) {
                      local_190 = &local_15c;
                      break;
                    }
                  }
                  bVar58 = uVar6 == 0;
                  uVar6 = uVar6 - 1;
                  if ((bVar58) || (uVar21 = *puVar24, uVar21 < uVar46)) break;
                } while( true );
              }
              *local_190 = 0;
              *local_1b8 = 0;
              ms->nextToUpdate = iVar62 - 8;
            }
LAB_0046f407:
            if (uVar51 != 0) {
              uVar33 = pZVar2[uVar51 - 1].len;
              if (((uint)local_90 < uVar33) || (0xfff < uVar33 + iVar36)) {
                UVar8 = 0;
                if (pZVar1->mlen == 0) {
                  UVar8 = pZVar1->litlen;
                }
                UVar7 = pZVar2[uVar51 - 1].off;
                uVar6 = iVar36 - UVar8;
                if (0x1000 < iVar36 - UVar8) {
                  uVar6 = 0;
                }
                iVar36 = (int)local_f8;
                goto LAB_0046f882;
              }
              uVar6 = local_b4 & 0xff;
              iVar62 = UVar7 + local_e4;
              pUVar52 = (U32 *)((long)pZVar3->rep + local_f0);
              uVar14 = 0;
              do {
                UVar8 = pZVar2[uVar14].off;
                rVar70 = ZSTD_updateRep(pUVar52,UVar8,uVar6);
                auVar61 = _DAT_00526580;
                auVar60 = _DAT_00526570;
                auVar59 = _DAT_00526560;
                uVar33 = uVar25;
                if (uVar14 != 0) {
                  uVar33 = pZVar2[uVar14 - 1].len + 1;
                }
                uVar26 = pZVar2[uVar14].len;
                if (uVar33 <= uVar26) {
                  uVar35 = 0x1f;
                  if (UVar8 + 1 != 0) {
                    for (; UVar8 + 1 >> uVar35 == 0; uVar35 = uVar35 - 1) {
                    }
                  }
                  uVar22 = iVar36 + uVar26;
                  do {
                    pUVar57 = (U32 *)(ulong)uVar22;
                    if ((ms->opt).priceType == zop_predef) {
                      uVar21 = uVar26 - 2;
                      iVar63 = 0x1f;
                      if (uVar21 != 0) {
                        for (; uVar21 >> iVar63 == 0; iVar63 = iVar63 + -1) {
                        }
                      }
                      iVar63 = (iVar63 + uVar35) * 0x100 + (uVar21 * 0x100 >> ((byte)iVar63 & 0x1f))
                               + 0x1000;
                    }
                    else {
                      uVar21 = uVar26 - 3;
                      uVar46 = (ms->opt).offCodeFreq[uVar35] + 1;
                      iVar63 = 0x1f;
                      if (uVar46 != 0) {
                        for (; uVar46 >> iVar63 == 0; iVar63 = iVar63 + -1) {
                        }
                      }
                      if (uVar21 < 0x80) {
                        uVar21 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar21];
                      }
                      else {
                        uVar43 = 0x1f;
                        if (uVar21 != 0) {
                          for (; uVar21 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                          }
                        }
                        uVar21 = (uVar43 ^ 0xffffffe0) + 0x44;
                      }
                      uVar43 = (ms->opt).matchLengthFreq[uVar21] + 1;
                      iVar64 = 0x1f;
                      if (uVar43 != 0) {
                        for (; uVar43 >> iVar64 == 0; iVar64 = iVar64 + -1) {
                        }
                      }
                      iVar63 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice)
                               - ((uVar46 * 0x100 >> ((byte)iVar63 & 0x1f)) +
                                 (uVar43 * 0x100 >> ((byte)iVar64 & 0x1f)))) +
                               ((ML_bits[uVar21] + uVar35) - (iVar63 + iVar64)) * 0x100 + 0x33;
                    }
                    iVar63 = iVar63 + iVar62;
                    uVar21 = uVar26 + iVar36;
                    if ((uint)pUVar31 < uVar21) {
                      uVar44 = (ulong)pUVar31 & 0xffffffff;
                      lVar13 = ~uVar44 + (long)pUVar57;
                      auVar65._8_4_ = (int)lVar13;
                      auVar65._0_8_ = lVar13;
                      auVar65._12_4_ = (int)((ulong)lVar13 >> 0x20);
                      pZVar15 = local_88 + uVar44;
                      uVar53 = 0;
                      do {
                        auVar66._8_4_ = (int)uVar53;
                        auVar66._0_8_ = uVar53;
                        auVar66._12_4_ = (int)(uVar53 >> 0x20);
                        auVar67 = (auVar66 | auVar60) ^ auVar61;
                        iVar64 = SUB164(auVar65 ^ auVar61,0);
                        bVar58 = iVar64 < auVar67._0_4_;
                        iVar68 = SUB164(auVar65 ^ auVar61,4);
                        iVar69 = auVar67._4_4_;
                        if ((bool)(~(iVar68 < iVar69 || iVar69 == iVar68 && bVar58) & 1)) {
                          pZVar15[-3].price = 0x40000000;
                        }
                        if (iVar68 >= iVar69 && (iVar69 != iVar68 || !bVar58)) {
                          pZVar15[-2].price = 0x40000000;
                        }
                        auVar67 = (auVar66 | auVar59) ^ auVar61;
                        iVar69 = auVar67._4_4_;
                        if (iVar69 <= iVar68 && (iVar69 != iVar68 || auVar67._0_4_ <= iVar64)) {
                          pZVar15[-1].price = 0x40000000;
                          pZVar15->price = 0x40000000;
                        }
                        uVar53 = uVar53 + 4;
                        pZVar15 = pZVar15 + 4;
                      } while (((long)pUVar57 + (3 - uVar44) & 0xfffffffffffffffc) != uVar53);
LAB_0046f711:
                      pZVar3[uVar21].mlen = uVar26;
                      pZVar3[uVar21].off = UVar8;
                      pZVar3[uVar21].litlen = UVar20;
                      pZVar3[uVar21].price = iVar63;
                      *(long *)pZVar3[uVar21].rep = rVar70.rep._0_8_;
                      pZVar3[uVar21].rep[2] = rVar70.rep[2];
                      pUVar31 = pUVar57;
                    }
                    else {
                      pUVar57 = pUVar31;
                      if (iVar63 < pZVar3[uVar21].price) goto LAB_0046f711;
                    }
                    uVar26 = uVar26 - 1;
                    uVar22 = uVar22 - 1;
                  } while (uVar33 <= uVar26);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar51);
            }
          }
        }
        pUVar57 = (U32 *)(ulong)(iVar36 + 1U);
        pUVar52 = pUVar31;
      } while (iVar36 + 1U <= (uint)pUVar31);
    }
    uVar14 = (ulong)pUVar52 & 0xffffffff;
    UVar7 = pZVar3[uVar14].off;
    uVar33 = pZVar3[uVar14].mlen;
    UVar20 = pZVar3[uVar14].litlen;
    local_98 = pZVar3[uVar14].rep[2];
    local_a0 = *(undefined8 *)pZVar3[uVar14].rep;
    uVar6 = (uint)pUVar52 - (UVar20 + uVar33);
    iVar36 = pZVar3[uVar14].price;
    if ((uint)pUVar52 < UVar20 + uVar33) {
      uVar6 = 0;
    }
  }
LAB_0046f882:
  local_f8 = CONCAT44(local_f8._4_4_,iVar36);
  uVar26 = uVar6 + 1;
  pZVar3[uVar26].price = iVar36;
  pZVar3[uVar26].off = UVar7;
  pZVar3[uVar26].mlen = uVar33;
  pZVar3[uVar26].litlen = UVar20;
  *(undefined8 *)pZVar3[uVar26].rep = local_a0;
  pZVar3[uVar26].rep[2] = local_98;
  uVar14 = (ulong)uVar6;
  src = local_128;
  poVar37 = local_d8;
  if (uVar6 == 0) {
    uVar33 = 1;
LAB_0046f940:
    local_1c8 = local_140 & 0xffffffff;
    local_1a8 = local_140 >> 0x20;
    do {
      uVar6 = pZVar3[uVar33].litlen;
      uVar14 = (ulong)uVar6;
      UVar20 = pZVar3[uVar33].mlen;
      if (UVar20 == 0) {
        puVar39 = (ulong *)(uVar14 + (long)src);
      }
      else {
        uVar35 = pZVar3[uVar33].off;
        if (uVar35 < 3) {
          uVar22 = (uVar14 == 0) + uVar35;
          if (uVar22 != 0) {
            if (uVar22 == 3) {
              uVar53 = (ulong)((int)local_1c8 - 1);
LAB_0046f9ee:
              local_138 = (U32)local_1a8;
            }
            else {
              uVar53 = (ulong)*(uint *)((long)&local_140 + (ulong)uVar22 * 4);
              if (uVar22 != 1) goto LAB_0046f9ee;
            }
            uVar22 = (uint)uVar53;
            goto LAB_0046fa10;
          }
        }
        else {
          local_138 = (U32)local_1a8;
          uVar22 = uVar35 - 2;
          uVar53 = (ulong)uVar22;
LAB_0046fa10:
          local_140 = CONCAT44((int)local_1c8,uVar22);
          local_1a8 = local_1c8;
          local_1c8 = uVar53;
        }
        ZSTD_updateStats(poVar37,uVar6,(BYTE *)src,uVar35,UVar20);
        puVar18 = (ulong *)local_b0->lit;
        puVar39 = (ulong *)((long)puVar18 + uVar14);
        puVar28 = (ulong *)src;
        do {
          *puVar18 = *puVar28;
          puVar18 = puVar18 + 1;
          puVar28 = puVar28 + 1;
        } while (puVar18 < puVar39);
        local_b0->lit = local_b0->lit + uVar14;
        if (uVar6 < 0x10000) {
          psVar17 = local_b0->sequences;
        }
        else {
          local_b0->longLengthID = 1;
          psVar17 = local_b0->sequences;
          local_b0->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)local_b0->sequencesStart) >> 3);
        }
        psVar17->litLength = (U16)uVar6;
        psVar17->offset = uVar35 + 1;
        if (0xffff < UVar20 - 3) {
          local_b0->longLengthID = 2;
          local_b0->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)local_b0->sequencesStart) >> 3);
        }
        psVar17->matchLength = (U16)(UVar20 - 3);
        local_b0->sequences = psVar17 + 1;
        src = (void *)((long)src + (ulong)(UVar20 + uVar6));
        poVar37 = local_d8;
        puVar39 = (ulong *)src;
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 <= uVar26);
  }
  else {
    do {
      uVar33 = uVar6;
      uVar35 = (uint)uVar14;
      uVar22 = pZVar3[uVar14].litlen + pZVar3[uVar14].mlen;
      pZVar15 = pZVar3 + uVar14;
      iVar36 = pZVar15->price;
      UVar10 = pZVar15->off;
      UVar9 = pZVar15->mlen;
      UVar5 = pZVar15->litlen;
      pZVar15 = pZVar3 + uVar14;
      UVar20 = pZVar15->rep[0];
      UVar8 = pZVar15->rep[1];
      UVar7 = pZVar15->rep[2];
      pZVar1 = pZVar3 + uVar33;
      pZVar1->litlen = pZVar15->litlen;
      pZVar1->rep[0] = UVar20;
      pZVar1->rep[1] = UVar8;
      pZVar1->rep[2] = UVar7;
      pZVar15 = pZVar3 + uVar33;
      pZVar15->price = iVar36;
      pZVar15->off = UVar10;
      pZVar15->mlen = UVar9;
      pZVar15->litlen = UVar5;
      uVar14 = (ulong)(uVar35 - uVar22);
      if (uVar22 > uVar35) {
        uVar14 = 0;
      }
      uVar6 = uVar33 - 1;
    } while (uVar22 <= uVar35 && uVar35 - uVar22 != 0);
    if (uVar33 <= uVar26) goto LAB_0046f940;
  }
  ZSTD_setBasePrices(poVar37,2);
  psVar34 = local_b0;
LAB_0046faf6:
  if (local_118 <= puVar39) goto LAB_0046fc42;
  goto LAB_0046c2ec;
LAB_00473358:
  local_210 = (uint *)&local_140;
  goto LAB_0047090e;
LAB_00473365:
  local_178 = (uint *)&local_140;
LAB_0047090e:
  *local_210 = 0;
  *local_178 = 0;
  ms->nextToUpdate = iVar36 - 8;
LAB_00470bef:
  src = local_a8;
  poVar37 = local_d8;
  if (uVar22 == 0) {
LAB_00470c86:
    puVar38 = (ulong *)((long)puVar38 + 1);
  }
  else {
    uVar25 = local_e4 & 0xff;
    lVar13 = 0;
    do {
      pZVar3->rep[lVar13] = local_108[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    pZVar3->mlen = 0;
    pZVar3->litlen = UVar20;
    iVar36 = ZSTD_literalsContribution((BYTE *)local_a8,UVar20,local_d8,2);
    pZVar3->price = iVar36;
    uVar33 = pZVar2[uVar22 - 1].len;
    if (local_b4 < uVar33) {
      UVar7 = pZVar2[uVar22 - 1].off;
      uVar25 = 0;
      iVar62 = (uint)local_100;
    }
    else {
      UVar8 = ZSTD_litLengthPrice(0,poVar37,2);
      auVar60 = _DAT_00526570;
      auVar59 = _DAT_00526560;
      uVar14 = 0;
      pZVar15 = local_c0;
      do {
        auVar61._8_4_ = (int)uVar14;
        auVar61._0_8_ = uVar14;
        auVar61._12_4_ = (int)(uVar14 >> 0x20);
        auVar67 = (auVar61 | auVar60) ^ _DAT_00526580;
        if ((bool)(~(auVar67._4_4_ == local_58._4_4_ && (int)local_58._0_4_ < auVar67._0_4_ ||
                    (int)local_58._4_4_ < auVar67._4_4_) & 1)) {
          pZVar15[-3].price = 0x40000000;
        }
        if ((auVar67._12_4_ != local_58._12_4_ || auVar67._8_4_ <= (int)local_58._8_4_) &&
            auVar67._12_4_ <= (int)local_58._12_4_) {
          pZVar15[-2].price = 0x40000000;
        }
        auVar61 = (auVar61 | auVar59) ^ _DAT_00526580;
        iVar62 = auVar61._4_4_;
        if (iVar62 <= (int)local_58._4_4_ &&
            (iVar62 != local_58._4_4_ || auVar61._0_4_ <= (int)local_58._0_4_)) {
          pZVar15[-1].price = 0x40000000;
          pZVar15->price = 0x40000000;
        }
        uVar14 = uVar14 + 4;
        pZVar15 = pZVar15 + 4;
      } while (local_d0 != uVar14);
      uVar53 = 0;
      uVar14 = (ulong)uVar6;
      do {
        UVar7 = pZVar2[uVar53].off;
        uVar33 = pZVar2[uVar53].len;
        rVar70 = ZSTD_updateRep(local_108,UVar7,uVar25);
        if ((uint)uVar14 <= uVar33) {
          uVar26 = 0x1f;
          if (UVar7 + 1 != 0) {
            for (; UVar7 + 1 >> uVar26 == 0; uVar26 = uVar26 - 1) {
            }
          }
          uVar35 = (uint)uVar14 * 0x100 - 0x200;
          do {
            UVar10 = (U32)uVar14;
            if ((ms->opt).priceType == zop_predef) {
              iVar62 = 0x1f;
              if (UVar10 - 2 != 0) {
                for (; UVar10 - 2 >> iVar62 == 0; iVar62 = iVar62 + -1) {
                }
              }
              iVar62 = (iVar62 + uVar26) * 0x100 + (uVar35 >> ((byte)iVar62 & 0x1f)) + 0x1000;
            }
            else {
              uVar46 = UVar10 - 3;
              uVar21 = (ms->opt).offCodeFreq[uVar26] + 1;
              iVar62 = 0x1f;
              if (uVar21 != 0) {
                for (; uVar21 >> iVar62 == 0; iVar62 = iVar62 + -1) {
                }
              }
              if (uVar46 < 0x80) {
                uVar46 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar46];
              }
              else {
                uVar51 = 0x1f;
                if (uVar46 != 0) {
                  for (; uVar46 >> uVar51 == 0; uVar51 = uVar51 - 1) {
                  }
                }
                uVar46 = (uVar51 ^ 0xffffffe0) + 0x44;
              }
              uVar51 = (ms->opt).matchLengthFreq[uVar46] + 1;
              iVar63 = 0x1f;
              if (uVar51 != 0) {
                for (; uVar51 >> iVar63 == 0; iVar63 = iVar63 + -1) {
                }
              }
              iVar62 = ((ML_bits[uVar46] + uVar26) - (iVar62 + iVar63)) * 0x100 +
                       (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                       ((uVar21 * 0x100 >> ((byte)iVar62 & 0x1f)) +
                       (uVar51 * 0x100 >> ((byte)iVar63 & 0x1f)))) + 0x33;
            }
            pZVar3[uVar14].mlen = UVar10;
            pZVar3[uVar14].off = UVar7;
            pZVar3[uVar14].litlen = UVar20;
            pZVar3[uVar14].price = iVar62 + UVar8 + iVar36;
            *(long *)pZVar3[uVar14].rep = rVar70.rep._0_8_;
            pZVar3[uVar14].rep[2] = rVar70.rep[2];
            uVar14 = (ulong)(UVar10 + 1);
            uVar35 = uVar35 + 0x100;
          } while (UVar10 + 1 <= uVar33);
        }
        uVar53 = uVar53 + 1;
      } while (uVar53 != uVar22);
      uVar25 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar25;
      if (uVar25 != 0) {
        local_90 = (uint *)((long)puVar38 + 0xc);
        local_68 = puVar38 + 1;
        local_70 = (U32 *)((long)puVar38 + 0xb);
        uVar53 = 1;
LAB_00470f58:
        uVar44 = uVar53;
        poVar37 = local_d8;
        iVar36 = (int)uVar44;
        pZVar15 = pZVar3 + (iVar36 - 1U);
        UVar20 = 1;
        if (pZVar3[iVar36 - 1U].mlen == 0) {
          UVar20 = pZVar15->litlen + 1;
        }
        puVar18 = (ulong *)((long)puVar38 + uVar44);
        iVar62 = 0x600;
        if ((ms->opt).priceType != zop_predef) {
          uVar25 = (ms->opt).litFreq[*(byte *)((long)puVar18 + -1)] + 1;
          iVar62 = 0x1f;
          if (uVar25 != 0) {
            for (; uVar25 >> iVar62 == 0; iVar62 = iVar62 + -1) {
            }
          }
          iVar62 = (ms->opt).litSumBasePrice -
                   (iVar62 * 0x100 + (uVar25 * 0x100 >> ((byte)iVar62 & 0x1f)));
        }
        iVar63 = pZVar15->price;
        UVar8 = ZSTD_litLengthPrice(UVar20,local_d8,2);
        UVar7 = ZSTD_litLengthPrice(UVar20 - 1,poVar37,2);
        uVar33 = (UVar8 + iVar62 + iVar63) - UVar7;
        pZVar1 = pZVar3 + uVar44;
        uVar25 = pZVar3[uVar44].price;
        if ((int)uVar33 <= pZVar3[uVar44].price) {
          pZVar1->off = 0;
          pZVar1->mlen = 0;
          pZVar1->litlen = UVar20;
          pZVar1->price = uVar33;
          *(undefined8 *)pZVar1->rep = *(undefined8 *)pZVar15->rep;
          pZVar1->rep[2] = pZVar15->rep[2];
          uVar25 = uVar33;
        }
        if (puVar39 < puVar18) goto LAB_004710f0;
        if (iVar36 != (int)uVar14) {
          UVar8 = pZVar1->mlen;
          UVar20 = 0;
          if (UVar8 == 0) {
            UVar20 = pZVar1->litlen;
          }
          local_128 = (ulong *)(uVar44 * 0x1c);
          local_e4 = uVar25;
          UVar7 = ZSTD_litLengthPrice(0,local_d8,2);
          pBVar32 = (ms->window).base;
          uVar25 = ms->nextToUpdate;
          uVar53 = (ulong)uVar25;
          if (puVar18 < pBVar32 + uVar53) goto LAB_004710f0;
          UVar10 = (ms->cParams).minMatch;
          iVar62 = (int)puVar18;
          uVar33 = iVar62 - (int)pBVar32;
          while (uVar25 < uVar33) {
            UVar9 = ZSTD_insertBt1(ms,pBVar32 + uVar53,(BYTE *)puVar56,UVar10,0);
            uVar25 = (int)uVar53 + UVar9;
            uVar53 = (ulong)uVar25;
          }
          local_e0 = (long)local_68 + uVar44;
          ms->nextToUpdate = uVar33;
          local_130._4_4_ = (undefined4)((ulong)local_130 >> 0x20);
          local_c8._4_4_ = (undefined4)((ulong)local_c8 >> 0x20);
          local_150._4_4_ = (undefined4)((ulong)local_150 >> 0x20);
          if (UVar10 - 6 < 2) {
            uVar53 = (ulong)(UVar8 != 0);
            uVar25 = (ms->cParams).targetLength;
            if (0xffe < uVar25) {
              uVar25 = 0xfff;
            }
            local_158 = (uint *)(ms->window).base;
            uVar35 = iVar62 - (int)local_158;
            local_f0 = (ulong)uVar35;
            local_120 = (ulong *)ms->hashTable;
            uVar54 = 0;
            local_f8 = *puVar18 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
            local_110 = ms->chainTable;
            uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar26 = uVar35 - uVar33;
            if (uVar35 < uVar33) {
              uVar26 = 0;
            }
            local_130 = (U32 *)CONCAT44(local_130._4_4_,uVar26);
            UVar10 = (ms->window).lowLimit;
            uVar46 = UVar10 + (UVar10 == 0);
            local_c8 = (U32 *)CONCAT44(local_c8._4_4_,uVar33);
            uVar40 = (ulong)((uVar33 & uVar35) * 2);
            local_1f8 = local_110 + uVar40;
            UVar10 = (ms->window).dictLimit;
            uVar21 = *(uint *)((long)local_120 + local_f8 * 4);
            iVar62 = uVar35 + 9;
            uVar22 = (ms->cParams).searchLog;
            local_150 = (U32 *)CONCAT44(local_150._4_4_,uVar22);
            uVar47 = uVar53 + 3;
            puVar29 = (ulong *)((long)puVar18 + 4);
            puVar28 = local_148;
            do {
              if (uVar53 == 3) {
                uVar51 = pZVar1->rep[0] - 1;
              }
              else {
                uVar51 = pZVar1->rep[uVar53];
              }
              uVar43 = 0;
              if ((uVar51 - 1 < uVar35 - UVar10) &&
                 (uVar43 = 0, (uint)*puVar18 == *(uint *)((long)puVar18 - (ulong)uVar51))) {
                lVar13 = -(ulong)uVar51;
                puVar19 = (ulong *)((long)puVar29 + lVar13);
                puVar42 = puVar29;
                if (puVar29 < puVar11) {
                  if (*puVar19 == *puVar29) {
                    lVar13 = lVar13 + uVar44;
                    lVar48 = 0;
                    do {
                      puVar42 = (ulong *)((long)local_90 + lVar48 + uVar44);
                      if (puVar11 <= puVar42) {
                        puVar19 = (ulong *)((long)local_90 + lVar48 + lVar13);
                        goto LAB_004716c3;
                      }
                      uVar45 = *(ulong *)((long)local_90 + lVar48 + lVar13);
                      lVar48 = lVar48 + 8;
                    } while (uVar45 == *puVar42);
                    uVar45 = *puVar42 ^ uVar45;
                    uVar49 = 0;
                    if (uVar45 != 0) {
                      for (; (uVar45 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                      }
                    }
                    uVar43 = ((uint)(uVar49 >> 3) & 0x1fffffff) + (int)lVar48;
                  }
                  else {
                    uVar49 = *puVar29 ^ *puVar19;
                    uVar45 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                      }
                    }
                    uVar43 = (uint)(uVar45 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_004716c3:
                  if ((puVar42 < puVar12) && ((uint)*puVar19 == (uint)*puVar42)) {
                    puVar42 = (ulong *)((long)puVar42 + 4);
                    puVar19 = (ulong *)((long)puVar19 + 4);
                  }
                  if ((puVar42 < local_118) && ((short)*puVar19 == (short)*puVar42)) {
                    puVar42 = (ulong *)((long)puVar42 + 2);
                    puVar19 = (ulong *)((long)puVar19 + 2);
                  }
                  if (puVar42 < puVar56) {
                    puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar42));
                  }
                  uVar43 = (int)puVar42 - (int)puVar29;
                }
                uVar43 = uVar43 + 4;
              }
              puVar19 = (ulong *)(ulong)uVar43;
              if (puVar28 < puVar19) {
                pZVar2[uVar54].off = (int)uVar53 - (uint)(UVar8 != 0);
                pZVar2[uVar54].len = uVar43;
                uVar51 = (int)uVar54 + 1;
                uVar54 = (ulong)uVar51;
                if ((uVar25 < uVar43) ||
                   (puVar28 = puVar19, (ulong *)((long)puVar18 + (long)puVar19) == puVar56))
                goto LAB_00472487;
              }
              uVar51 = (uint)uVar54;
              uVar53 = uVar53 + 1;
            } while (uVar53 < uVar47);
            *(uint *)((long)local_120 + local_f8 * 4) = uVar35;
            local_1e8 = local_110 + uVar40 + 1;
            if (uVar46 <= uVar21) {
              uVar25 = ~(-1 << ((byte)uVar22 & 0x1f));
              local_f0 = (ulong)(uVar35 + 2);
              local_120 = (ulong *)(local_158 + 2);
              puVar29 = (ulong *)0x0;
              puVar19 = (ulong *)0x0;
              iVar63 = iVar62;
              do {
                puVar42 = puVar19;
                if (puVar29 < puVar19) {
                  puVar42 = puVar29;
                }
                lVar13 = (long)local_158 + (ulong)uVar21;
                puVar55 = (ulong *)((long)puVar18 + (long)puVar42);
                puVar50 = (ulong *)(lVar13 + (long)puVar42);
                puVar41 = puVar55;
                if (puVar55 < puVar11) {
                  if (*puVar50 == *puVar55) {
                    pBVar32 = (BYTE *)((ulong)uVar21 + (long)puVar42);
                    lVar48 = 0;
                    do {
                      puVar41 = (ulong *)((long)puVar42 + lVar48 + local_e0);
                      if (puVar11 <= puVar41) {
                        puVar50 = (ulong *)(pBVar32 + lVar48 + (long)local_120);
                        goto LAB_00471896;
                      }
                      uVar53 = *(ulong *)((BYTE *)((long)local_120 + (long)pBVar32) + lVar48);
                      lVar48 = lVar48 + 8;
                    } while (uVar53 == *puVar41);
                    uVar53 = *puVar41 ^ uVar53;
                    uVar44 = 0;
                    if (uVar53 != 0) {
                      for (; (uVar53 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar53 = (uVar44 >> 3 & 0x1fffffff) + lVar48;
                  }
                  else {
                    uVar44 = *puVar55 ^ *puVar50;
                    uVar53 = 0;
                    if (uVar44 != 0) {
                      for (; (uVar44 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                      }
                    }
                    uVar53 = uVar53 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00471896:
                  if ((puVar41 < puVar12) && ((uint)*puVar50 == (uint)*puVar41)) {
                    puVar41 = (ulong *)((long)puVar41 + 4);
                    puVar50 = (ulong *)((long)puVar50 + 4);
                  }
                  if ((puVar41 < local_118) && ((short)*puVar50 == (short)*puVar41)) {
                    puVar41 = (ulong *)((long)puVar41 + 2);
                    puVar50 = (ulong *)((long)puVar50 + 2);
                  }
                  if (puVar41 < puVar56) {
                    puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar50 == (BYTE)*puVar41));
                  }
                  uVar53 = (long)puVar41 - (long)puVar55;
                }
                puVar42 = (ulong *)(uVar53 + (long)puVar42);
                iVar62 = iVar63;
                if (puVar28 < puVar42) {
                  iVar62 = uVar21 + (U32)puVar42;
                  if (puVar42 <= (ulong *)(ulong)(iVar63 - uVar21)) {
                    iVar62 = iVar63;
                  }
                  pZVar2[uVar54].off = (uVar35 + 2) - uVar21;
                  pZVar2[uVar54].len = (U32)puVar42;
                  uVar51 = (int)uVar54 + 1;
                  uVar54 = (ulong)uVar51;
                  if (((ulong *)0x1000 < puVar42) ||
                     (puVar28 = puVar42, (ulong *)((long)puVar18 + (long)puVar42) == puVar56))
                  break;
                }
                uVar51 = (uint)uVar54;
                puVar24 = local_110 + (uVar21 & uVar33) * 2;
                if (*(byte *)(lVar13 + (long)puVar42) < *(byte *)((long)puVar18 + (long)puVar42)) {
                  *local_1f8 = uVar21;
                  if (uVar21 <= uVar26) goto LAB_004723f5;
                  local_1f8 = puVar24 + 1;
                  puVar24 = local_1e8;
                  puVar29 = puVar42;
                  puVar23 = local_1f8;
                  puVar42 = puVar19;
                }
                else {
                  *local_1e8 = uVar21;
                  puVar23 = puVar24;
                  if (uVar21 <= uVar26) goto LAB_004723e8;
                }
                bVar58 = uVar25 == 0;
                uVar25 = uVar25 - 1;
                local_1e8 = puVar24;
                if ((bVar58) ||
                   (uVar21 = *puVar23, puVar19 = puVar42, iVar63 = iVar62, uVar21 < uVar46)) break;
              } while( true );
            }
            goto LAB_00471c87;
          }
          if (UVar10 == 5) {
            uVar53 = (ulong)(UVar8 != 0);
            uVar25 = (ms->cParams).targetLength;
            if (0xffe < uVar25) {
              uVar25 = 0xfff;
            }
            local_158 = (uint *)(ms->window).base;
            uVar35 = iVar62 - (int)local_158;
            local_f0 = (ulong)uVar35;
            local_120 = (ulong *)ms->hashTable;
            uVar54 = 0;
            local_f8 = *puVar18 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
            local_110 = ms->chainTable;
            uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar26 = uVar35 - uVar33;
            if (uVar35 < uVar33) {
              uVar26 = 0;
            }
            local_130 = (U32 *)CONCAT44(local_130._4_4_,uVar26);
            UVar10 = (ms->window).lowLimit;
            uVar46 = UVar10 + (UVar10 == 0);
            local_c8 = (U32 *)CONCAT44(local_c8._4_4_,uVar33);
            uVar40 = (ulong)((uVar33 & uVar35) * 2);
            local_1f8 = local_110 + uVar40;
            UVar10 = (ms->window).dictLimit;
            uVar21 = *(uint *)((long)local_120 + local_f8 * 4);
            iVar62 = uVar35 + 9;
            uVar22 = (ms->cParams).searchLog;
            local_150 = (U32 *)CONCAT44(local_150._4_4_,uVar22);
            uVar47 = uVar53 + 3;
            puVar29 = (ulong *)((long)puVar18 + 4);
            puVar28 = local_148;
            do {
              if (uVar53 == 3) {
                uVar51 = pZVar1->rep[0] - 1;
              }
              else {
                uVar51 = pZVar1->rep[uVar53];
              }
              uVar43 = 0;
              if ((uVar51 - 1 < uVar35 - UVar10) &&
                 (uVar43 = 0, (uint)*puVar18 == *(uint *)((long)puVar18 - (ulong)uVar51))) {
                lVar13 = -(ulong)uVar51;
                puVar19 = (ulong *)((long)puVar29 + lVar13);
                puVar42 = puVar29;
                if (puVar29 < puVar11) {
                  if (*puVar19 == *puVar29) {
                    lVar13 = lVar13 + uVar44;
                    lVar48 = 0;
                    do {
                      puVar42 = (ulong *)((long)local_90 + lVar48 + uVar44);
                      if (puVar11 <= puVar42) {
                        puVar19 = (ulong *)((long)local_90 + lVar48 + lVar13);
                        goto LAB_00471ba3;
                      }
                      uVar45 = *(ulong *)((long)local_90 + lVar48 + lVar13);
                      lVar48 = lVar48 + 8;
                    } while (uVar45 == *puVar42);
                    uVar45 = *puVar42 ^ uVar45;
                    uVar49 = 0;
                    if (uVar45 != 0) {
                      for (; (uVar45 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                      }
                    }
                    uVar43 = ((uint)(uVar49 >> 3) & 0x1fffffff) + (int)lVar48;
                  }
                  else {
                    uVar49 = *puVar29 ^ *puVar19;
                    uVar45 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                      }
                    }
                    uVar43 = (uint)(uVar45 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_00471ba3:
                  if ((puVar42 < puVar12) && ((uint)*puVar19 == (uint)*puVar42)) {
                    puVar42 = (ulong *)((long)puVar42 + 4);
                    puVar19 = (ulong *)((long)puVar19 + 4);
                  }
                  if ((puVar42 < local_118) && ((short)*puVar19 == (short)*puVar42)) {
                    puVar42 = (ulong *)((long)puVar42 + 2);
                    puVar19 = (ulong *)((long)puVar19 + 2);
                  }
                  if (puVar42 < puVar56) {
                    puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar42));
                  }
                  uVar43 = (int)puVar42 - (int)puVar29;
                }
                uVar43 = uVar43 + 4;
              }
              puVar19 = (ulong *)(ulong)uVar43;
              if (puVar28 < puVar19) {
                pZVar2[uVar54].off = (int)uVar53 - (uint)(UVar8 != 0);
                pZVar2[uVar54].len = uVar43;
                uVar51 = (int)uVar54 + 1;
                uVar54 = (ulong)uVar51;
                if ((uVar25 < uVar43) ||
                   (puVar28 = puVar19, (ulong *)((long)puVar18 + (long)puVar19) == puVar56))
                goto LAB_00472487;
              }
              uVar51 = (uint)uVar54;
              uVar53 = uVar53 + 1;
            } while (uVar53 < uVar47);
            *(uint *)((long)local_120 + local_f8 * 4) = uVar35;
            local_1e8 = local_110 + uVar40 + 1;
            if (uVar46 <= uVar21) {
              uVar25 = ~(-1 << ((byte)uVar22 & 0x1f));
              local_f0 = (ulong)(uVar35 + 2);
              local_120 = (ulong *)(local_158 + 2);
              puVar29 = (ulong *)0x0;
              puVar19 = (ulong *)0x0;
              iVar63 = iVar62;
              do {
                puVar42 = puVar19;
                if (puVar29 < puVar19) {
                  puVar42 = puVar29;
                }
                lVar13 = (long)local_158 + (ulong)uVar21;
                puVar55 = (ulong *)((long)puVar18 + (long)puVar42);
                puVar50 = (ulong *)(lVar13 + (long)puVar42);
                puVar41 = puVar55;
                if (puVar55 < puVar11) {
                  if (*puVar50 == *puVar55) {
                    pBVar32 = (BYTE *)((ulong)uVar21 + (long)puVar42);
                    lVar48 = 0;
                    do {
                      puVar41 = (ulong *)((long)puVar42 + lVar48 + local_e0);
                      if (puVar11 <= puVar41) {
                        puVar50 = (ulong *)(pBVar32 + lVar48 + (long)local_120);
                        goto LAB_00472046;
                      }
                      uVar53 = *(ulong *)((BYTE *)((long)local_120 + (long)pBVar32) + lVar48);
                      lVar48 = lVar48 + 8;
                    } while (uVar53 == *puVar41);
                    uVar53 = *puVar41 ^ uVar53;
                    uVar44 = 0;
                    if (uVar53 != 0) {
                      for (; (uVar53 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar53 = (uVar44 >> 3 & 0x1fffffff) + lVar48;
                  }
                  else {
                    uVar44 = *puVar55 ^ *puVar50;
                    uVar53 = 0;
                    if (uVar44 != 0) {
                      for (; (uVar44 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                      }
                    }
                    uVar53 = uVar53 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00472046:
                  if ((puVar41 < puVar12) && ((uint)*puVar50 == (uint)*puVar41)) {
                    puVar41 = (ulong *)((long)puVar41 + 4);
                    puVar50 = (ulong *)((long)puVar50 + 4);
                  }
                  if ((puVar41 < local_118) && ((short)*puVar50 == (short)*puVar41)) {
                    puVar41 = (ulong *)((long)puVar41 + 2);
                    puVar50 = (ulong *)((long)puVar50 + 2);
                  }
                  if (puVar41 < puVar56) {
                    puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar50 == (BYTE)*puVar41));
                  }
                  uVar53 = (long)puVar41 - (long)puVar55;
                }
                puVar42 = (ulong *)(uVar53 + (long)puVar42);
                iVar62 = iVar63;
                if (puVar28 < puVar42) {
                  iVar62 = uVar21 + (U32)puVar42;
                  if (puVar42 <= (ulong *)(ulong)(iVar63 - uVar21)) {
                    iVar62 = iVar63;
                  }
                  pZVar2[uVar54].off = (uVar35 + 2) - uVar21;
                  pZVar2[uVar54].len = (U32)puVar42;
                  uVar51 = (int)uVar54 + 1;
                  uVar54 = (ulong)uVar51;
                  if (((ulong *)0x1000 < puVar42) ||
                     (puVar28 = puVar42, (ulong *)((long)puVar18 + (long)puVar42) == puVar56))
                  break;
                }
                uVar51 = (uint)uVar54;
                puVar24 = local_110 + (uVar21 & uVar33) * 2;
                if (*(byte *)(lVar13 + (long)puVar42) < *(byte *)((long)puVar18 + (long)puVar42)) {
                  *local_1f8 = uVar21;
                  if (uVar21 <= uVar26) goto LAB_004723f5;
                  local_1f8 = puVar24 + 1;
                  puVar24 = local_1e8;
                  puVar29 = puVar42;
                  puVar23 = local_1f8;
                  puVar42 = puVar19;
                }
                else {
                  *local_1e8 = uVar21;
                  puVar23 = puVar24;
                  if (uVar21 <= uVar26) goto LAB_004723e8;
                }
                bVar58 = uVar25 == 0;
                uVar25 = uVar25 - 1;
                local_1e8 = puVar24;
                if ((bVar58) ||
                   (uVar21 = *puVar23, puVar19 = puVar42, iVar63 = iVar62, uVar21 < uVar46)) break;
              } while( true );
            }
            goto LAB_00471c87;
          }
          if (UVar10 != 3) {
            uVar53 = (ulong)(UVar8 != 0);
            uVar25 = (ms->cParams).targetLength;
            if (0xffe < uVar25) {
              uVar25 = 0xfff;
            }
            local_158 = (uint *)(ms->window).base;
            uVar35 = iVar62 - (int)local_158;
            local_f0 = (ulong)uVar35;
            local_120 = (ulong *)ms->hashTable;
            uVar54 = 0;
            local_f8 = (ulong)((uint)*puVar18 * -0x61c8864f >>
                              (-(char)(ms->cParams).hashLog & 0x1fU));
            local_110 = ms->chainTable;
            uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar26 = uVar35 - uVar33;
            if (uVar35 < uVar33) {
              uVar26 = 0;
            }
            local_130 = (U32 *)CONCAT44(local_130._4_4_,uVar26);
            UVar10 = (ms->window).lowLimit;
            uVar46 = UVar10 + (UVar10 == 0);
            local_c8 = (U32 *)CONCAT44(local_c8._4_4_,uVar33);
            uVar47 = (ulong)((uVar33 & uVar35) * 2);
            local_1f8 = local_110 + uVar47;
            local_1e8 = local_110 + uVar47 + 1;
            UVar10 = (ms->window).dictLimit;
            uVar21 = *(uint *)((long)local_120 + local_f8 * 4);
            iVar62 = uVar35 + 9;
            uVar22 = (ms->cParams).searchLog;
            local_150 = (U32 *)CONCAT44(local_150._4_4_,uVar22);
            uVar47 = uVar53 + 3;
            puVar29 = (ulong *)((long)puVar18 + 4);
            puVar28 = local_148;
            do {
              if (uVar53 == 3) {
                uVar51 = pZVar1->rep[0] - 1;
              }
              else {
                uVar51 = pZVar1->rep[uVar53];
              }
              uVar43 = 0;
              if ((uVar51 - 1 < uVar35 - UVar10) &&
                 (uVar43 = 0, (uint)*puVar18 == *(uint *)((long)puVar18 - (ulong)uVar51))) {
                lVar13 = -(ulong)uVar51;
                puVar19 = (ulong *)((long)puVar29 + lVar13);
                puVar42 = puVar29;
                if (puVar29 < puVar11) {
                  if (*puVar19 == *puVar29) {
                    lVar13 = lVar13 + uVar44;
                    lVar48 = 0;
                    do {
                      puVar42 = (ulong *)((long)local_90 + lVar48 + uVar44);
                      if (puVar11 <= puVar42) {
                        puVar19 = (ulong *)((long)local_90 + lVar48 + lVar13);
                        goto LAB_00471e44;
                      }
                      uVar40 = *(ulong *)((long)local_90 + lVar48 + lVar13);
                      lVar48 = lVar48 + 8;
                    } while (uVar40 == *puVar42);
                    uVar40 = *puVar42 ^ uVar40;
                    uVar45 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                      }
                    }
                    uVar43 = ((uint)(uVar45 >> 3) & 0x1fffffff) + (int)lVar48;
                  }
                  else {
                    uVar45 = *puVar29 ^ *puVar19;
                    uVar40 = 0;
                    if (uVar45 != 0) {
                      for (; (uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    uVar43 = (uint)(uVar40 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_00471e44:
                  if ((puVar42 < puVar12) && ((uint)*puVar19 == (uint)*puVar42)) {
                    puVar42 = (ulong *)((long)puVar42 + 4);
                    puVar19 = (ulong *)((long)puVar19 + 4);
                  }
                  if ((puVar42 < local_118) && ((short)*puVar19 == (short)*puVar42)) {
                    puVar42 = (ulong *)((long)puVar42 + 2);
                    puVar19 = (ulong *)((long)puVar19 + 2);
                  }
                  if (puVar42 < puVar56) {
                    puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar42));
                  }
                  uVar43 = (int)puVar42 - (int)puVar29;
                }
                uVar43 = uVar43 + 4;
              }
              puVar19 = (ulong *)(ulong)uVar43;
              if (puVar28 < puVar19) {
                pZVar2[uVar54].off = (int)uVar53 - (uint)(UVar8 != 0);
                pZVar2[uVar54].len = uVar43;
                uVar51 = (int)uVar54 + 1;
                uVar54 = (ulong)uVar51;
                if ((uVar25 < uVar43) ||
                   (puVar28 = puVar19, (ulong *)((long)puVar18 + (long)puVar19) == puVar56))
                goto LAB_00472487;
              }
              uVar51 = (uint)uVar54;
              uVar53 = uVar53 + 1;
            } while (uVar53 < uVar47);
            *(uint *)((long)local_120 + local_f8 * 4) = uVar35;
            if (uVar46 <= uVar21) {
              uVar25 = ~(-1 << ((byte)uVar22 & 0x1f));
              local_f0 = (ulong)(uVar35 + 2);
              local_120 = (ulong *)(local_158 + 2);
              puVar29 = (ulong *)0x0;
              puVar19 = (ulong *)0x0;
              iVar63 = iVar62;
              do {
                puVar42 = puVar19;
                if (puVar29 < puVar19) {
                  puVar42 = puVar29;
                }
                lVar13 = (long)local_158 + (ulong)uVar21;
                puVar55 = (ulong *)((long)puVar18 + (long)puVar42);
                puVar50 = (ulong *)(lVar13 + (long)puVar42);
                puVar41 = puVar55;
                if (puVar55 < puVar11) {
                  if (*puVar50 == *puVar55) {
                    pBVar32 = (BYTE *)((ulong)uVar21 + (long)puVar42);
                    lVar48 = 0;
                    do {
                      puVar41 = (ulong *)((long)puVar42 + lVar48 + local_e0);
                      if (puVar11 <= puVar41) {
                        puVar50 = (ulong *)(pBVar32 + lVar48 + (long)local_120);
                        goto LAB_00472290;
                      }
                      uVar53 = *(ulong *)((BYTE *)((long)local_120 + (long)pBVar32) + lVar48);
                      lVar48 = lVar48 + 8;
                    } while (uVar53 == *puVar41);
                    uVar53 = *puVar41 ^ uVar53;
                    uVar44 = 0;
                    if (uVar53 != 0) {
                      for (; (uVar53 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar53 = (uVar44 >> 3 & 0x1fffffff) + lVar48;
                  }
                  else {
                    uVar44 = *puVar55 ^ *puVar50;
                    uVar53 = 0;
                    if (uVar44 != 0) {
                      for (; (uVar44 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                      }
                    }
                    uVar53 = uVar53 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00472290:
                  if ((puVar41 < puVar12) && ((uint)*puVar50 == (uint)*puVar41)) {
                    puVar41 = (ulong *)((long)puVar41 + 4);
                    puVar50 = (ulong *)((long)puVar50 + 4);
                  }
                  if ((puVar41 < local_118) && ((short)*puVar50 == (short)*puVar41)) {
                    puVar41 = (ulong *)((long)puVar41 + 2);
                    puVar50 = (ulong *)((long)puVar50 + 2);
                  }
                  if (puVar41 < puVar56) {
                    puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar50 == (BYTE)*puVar41));
                  }
                  uVar53 = (long)puVar41 - (long)puVar55;
                }
                puVar42 = (ulong *)(uVar53 + (long)puVar42);
                iVar62 = iVar63;
                if (puVar28 < puVar42) {
                  iVar62 = uVar21 + (U32)puVar42;
                  if (puVar42 <= (ulong *)(ulong)(iVar63 - uVar21)) {
                    iVar62 = iVar63;
                  }
                  pZVar2[uVar54].off = (uVar35 + 2) - uVar21;
                  pZVar2[uVar54].len = (U32)puVar42;
                  uVar51 = (int)uVar54 + 1;
                  uVar54 = (ulong)uVar51;
                  if (((ulong *)0x1000 < puVar42) ||
                     (puVar28 = puVar42, (ulong *)((long)puVar18 + (long)puVar42) == puVar56))
                  break;
                }
                uVar51 = (uint)uVar54;
                puVar24 = local_110 + (uVar21 & uVar33) * 2;
                if (*(byte *)(lVar13 + (long)puVar42) < *(byte *)((long)puVar18 + (long)puVar42)) {
                  *local_1f8 = uVar21;
                  if (uVar21 <= uVar26) {
                    local_1f8 = (uint *)&local_140;
                    break;
                  }
                  puVar24 = puVar24 + 1;
                  puVar29 = puVar42;
                  puVar42 = puVar19;
                  local_1f8 = puVar24;
                }
                else {
                  *local_1e8 = uVar21;
                  local_1e8 = puVar24;
                  if (uVar21 <= uVar26) {
                    local_1e8 = (uint *)&local_140;
                    break;
                  }
                }
                bVar58 = uVar25 == 0;
                uVar25 = uVar25 - 1;
                if ((bVar58) ||
                   (uVar21 = *puVar24, puVar19 = puVar42, iVar63 = iVar62, uVar21 < uVar46)) break;
              } while( true );
            }
            *local_1e8 = 0;
            *local_1f8 = 0;
            goto LAB_00471f27;
          }
          uVar53 = (ulong)(UVar8 != 0);
          uVar25 = (ms->cParams).targetLength;
          if (0xffe < uVar25) {
            uVar25 = 0xfff;
          }
          local_130 = (U32 *)(ms->window).base;
          uVar26 = iVar62 - (int)local_130;
          local_120 = (ulong *)(ulong)uVar26;
          local_150 = ms->hashTable;
          uVar54 = 0;
          local_78 = (ulong)((uint)*puVar18 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU))
          ;
          local_c8 = ms->chainTable;
          uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar62 = uVar26 - uVar33;
          if (uVar26 < uVar33) {
            iVar62 = 0;
          }
          local_110._4_4_ = (undefined4)((ulong)local_110 >> 0x20);
          local_110 = (U32 *)CONCAT44(local_110._4_4_,iVar62);
          UVar10 = (ms->window).lowLimit;
          uVar35 = UVar10 + (UVar10 == 0);
          uVar47 = local_f0 >> 0x20;
          local_f0 = CONCAT44((int)uVar47,uVar33);
          uVar47 = (ulong)((uVar33 & uVar26) * 2);
          local_158 = local_c8 + uVar47;
          local_1f8 = local_c8 + uVar47 + 1;
          UVar10 = (ms->window).dictLimit;
          local_f8 = (ulong)local_150[local_78];
          iVar62 = uVar26 + 9;
          uVar47 = local_80 >> 0x20;
          local_80 = CONCAT44((int)uVar47,(ms->cParams).searchLog);
          uVar47 = uVar53 + 3;
          puVar28 = (ulong *)((long)puVar18 + 3);
          puVar29 = local_148;
          do {
            if (uVar53 == 3) {
              UVar9 = pZVar1->rep[0] - 1;
            }
            else {
              UVar9 = pZVar1->rep[uVar53];
            }
            puVar19 = (ulong *)0x0;
            if ((UVar9 - 1 < uVar26 - UVar10) &&
               (((*(uint *)((long)puVar18 - (ulong)UVar9) ^ (uint)*puVar18) & 0xffffff) == 0)) {
              lVar13 = -(ulong)UVar9;
              puVar19 = (ulong *)((long)puVar28 + lVar13);
              puVar42 = puVar28;
              if (puVar28 < puVar11) {
                if (*puVar19 == *puVar28) {
                  lVar13 = lVar13 + uVar44;
                  lVar48 = 0;
                  do {
                    puVar42 = (ulong *)((long)local_70 + lVar48 + uVar44);
                    if (puVar11 <= puVar42) {
                      puVar19 = (ulong *)((long)local_70 + lVar48 + lVar13);
                      goto LAB_0047137a;
                    }
                    uVar40 = *(ulong *)((long)local_70 + lVar48 + lVar13);
                    lVar48 = lVar48 + 8;
                  } while (uVar40 == *puVar42);
                  uVar40 = *puVar42 ^ uVar40;
                  uVar45 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar33 = ((uint)(uVar45 >> 3) & 0x1fffffff) + (int)lVar48;
                }
                else {
                  uVar45 = *puVar28 ^ *puVar19;
                  uVar40 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar33 = (uint)(uVar40 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_0047137a:
                if ((puVar42 < puVar12) && ((uint)*puVar19 == (uint)*puVar42)) {
                  puVar42 = (ulong *)((long)puVar42 + 4);
                  puVar19 = (ulong *)((long)puVar19 + 4);
                }
                if ((puVar42 < local_118) && ((short)*puVar19 == (short)*puVar42)) {
                  puVar42 = (ulong *)((long)puVar42 + 2);
                  puVar19 = (ulong *)((long)puVar19 + 2);
                }
                if (puVar42 < puVar56) {
                  puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar42));
                }
                uVar33 = (int)puVar42 - (int)puVar28;
              }
              puVar19 = (ulong *)(ulong)(uVar33 + 3);
            }
            if (puVar29 < puVar19) {
              pZVar2[uVar54].off = (int)uVar53 - (uint)(UVar8 != 0);
              pZVar2[uVar54].len = (uint)puVar19;
              uVar51 = (int)uVar54 + 1;
              uVar54 = (ulong)uVar51;
              if ((uVar25 < (uint)puVar19) ||
                 (puVar29 = puVar19, (ulong *)((long)puVar18 + (long)puVar19) == puVar56))
              goto LAB_00472487;
            }
            uVar53 = uVar53 + 1;
          } while (uVar53 < uVar47);
          if ((puVar29 < (ulong *)0x3) &&
             (UVar10 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar18), uVar35 <= UVar10)) {
            UVar9 = (U32)local_120;
            if (0x3ffff < UVar9 - UVar10) goto LAB_0047243e;
            uVar53 = (ulong)UVar10;
            puVar28 = (ulong *)((long)local_130 + uVar53);
            puVar19 = puVar18;
            if (puVar18 < puVar11) {
              if (*puVar28 == *puVar18) {
                lVar13 = 0;
                do {
                  puVar19 = (ulong *)(local_e0 + lVar13);
                  if (puVar11 <= puVar19) {
                    puVar28 = (ulong *)((long)local_130 + lVar13 + uVar53 + 8);
                    goto LAB_0047298a;
                  }
                  uVar44 = *(ulong *)((long)local_130 + lVar13 + uVar53 + 8);
                  lVar13 = lVar13 + 8;
                } while (uVar44 == *puVar19);
                uVar44 = *puVar19 ^ uVar44;
                uVar53 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                  }
                }
                puVar19 = (ulong *)((uVar53 >> 3 & 0x1fffffff) + lVar13);
              }
              else {
                uVar44 = *puVar18 ^ *puVar28;
                uVar53 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                  }
                }
                puVar19 = (ulong *)(uVar53 >> 3 & 0x1fffffff);
              }
            }
            else {
LAB_0047298a:
              if ((puVar19 < puVar12) && ((uint)*puVar28 == (uint)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar28 = (ulong *)((long)puVar28 + 4);
              }
              if ((puVar19 < local_118) && ((short)*puVar28 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar28 = (ulong *)((long)puVar28 + 2);
              }
              if (puVar19 < puVar56) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar19));
              }
              puVar19 = (ulong *)((long)puVar19 - (long)puVar18);
            }
            if (puVar19 < (ulong *)0x3) goto LAB_0047243e;
            pZVar2->off = (UVar9 - UVar10) + 2;
            pZVar2->len = (U32)puVar19;
            if ((puVar19 <= (ulong *)(ulong)uVar25) &&
               (uVar54 = 1, puVar29 = puVar19, (ulong *)((long)puVar18 + (long)puVar19) != puVar56))
            goto LAB_0047243e;
            UVar9 = UVar9 + 1;
            uVar51 = 1;
          }
          else {
            UVar9 = (U32)local_120;
LAB_0047243e:
            uVar51 = (uint)uVar54;
            local_150[local_78] = UVar9;
            if (uVar35 <= (uint)local_f8) {
              uVar25 = ~(-1 << ((byte)local_80 & 0x1f));
              local_120 = (ulong *)(ulong)(UVar9 + 2);
              puVar28 = (ulong *)0x0;
              uVar53 = local_f8;
              puVar19 = (ulong *)0x0;
              do {
                puVar42 = puVar19;
                if (puVar28 < puVar19) {
                  puVar42 = puVar28;
                }
                uVar33 = (uint)uVar53;
                lVar13 = (long)local_130 + (uVar53 & 0xffffffff);
                puVar55 = (ulong *)((long)puVar18 + (long)puVar42);
                puVar50 = (ulong *)(lVar13 + (long)puVar42);
                puVar41 = puVar55;
                if (puVar55 < puVar11) {
                  if (*puVar50 == *puVar55) {
                    pBVar32 = (BYTE *)((uVar53 & 0xffffffff) + (long)puVar42);
                    lVar48 = 0;
                    do {
                      puVar41 = (ulong *)((long)puVar42 + lVar48 + local_e0);
                      if (puVar11 <= puVar41) {
                        puVar50 = (ulong *)(pBVar32 + lVar48 + (long)(local_130 + 2));
                        goto LAB_004727a7;
                      }
                      uVar53 = *(ulong *)((BYTE *)((long)(local_130 + 2) + (long)pBVar32) + lVar48);
                      lVar48 = lVar48 + 8;
                    } while (uVar53 == *puVar41);
                    uVar53 = *puVar41 ^ uVar53;
                    uVar44 = 0;
                    if (uVar53 != 0) {
                      for (; (uVar53 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar53 = (uVar44 >> 3 & 0x1fffffff) + lVar48;
                  }
                  else {
                    uVar44 = *puVar55 ^ *puVar50;
                    uVar53 = 0;
                    if (uVar44 != 0) {
                      for (; (uVar44 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                      }
                    }
                    uVar53 = uVar53 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_004727a7:
                  if ((puVar41 < puVar12) && ((uint)*puVar50 == (uint)*puVar41)) {
                    puVar41 = (ulong *)((long)puVar41 + 4);
                    puVar50 = (ulong *)((long)puVar50 + 4);
                  }
                  if ((puVar41 < local_118) && ((short)*puVar50 == (short)*puVar41)) {
                    puVar41 = (ulong *)((long)puVar41 + 2);
                    puVar50 = (ulong *)((long)puVar50 + 2);
                  }
                  if (puVar41 < puVar56) {
                    puVar41 = (ulong *)((long)puVar41 + (ulong)((BYTE)*puVar50 == (BYTE)*puVar41));
                  }
                  uVar53 = (long)puVar41 - (long)puVar55;
                }
                puVar42 = (ulong *)(uVar53 + (long)puVar42);
                if (puVar29 < puVar42) {
                  iVar63 = uVar33 + (U32)puVar42;
                  if (puVar42 <= (ulong *)(ulong)(iVar62 - uVar33)) {
                    iVar63 = iVar62;
                  }
                  iVar62 = iVar63;
                  pZVar2[uVar54].off = (UVar9 + 2) - uVar33;
                  pZVar2[uVar54].len = (U32)puVar42;
                  uVar51 = (int)uVar54 + 1;
                  uVar54 = (ulong)uVar51;
                  if (((ulong *)0x1000 < puVar42) ||
                     (puVar29 = puVar42, (ulong *)((long)puVar18 + (long)puVar42) == puVar56))
                  break;
                }
                uVar51 = (uint)uVar54;
                puVar24 = local_c8 + (uVar33 & (uint)local_f0) * 2;
                if (*(byte *)(lVar13 + (long)puVar42) < *(byte *)((long)puVar18 + (long)puVar42)) {
                  *local_158 = uVar33;
                  if (uVar33 <= (uint)local_110) {
                    local_158 = (uint *)&local_140;
                    break;
                  }
                  puVar24 = puVar24 + 1;
                  puVar28 = puVar42;
                  puVar42 = puVar19;
                  local_158 = puVar24;
                }
                else {
                  *local_1f8 = uVar33;
                  local_1f8 = puVar24;
                  if (uVar33 <= (uint)local_110) {
                    local_1f8 = (uint *)&local_140;
                    break;
                  }
                }
                bVar58 = uVar25 == 0;
                uVar25 = uVar25 - 1;
                if ((bVar58) || (uVar53 = (ulong)*puVar24, puVar19 = puVar42, *puVar24 < uVar35))
                break;
              } while( true );
            }
            *local_1f8 = 0;
            *local_158 = 0;
            UVar9 = iVar62 - 8;
          }
          ms->nextToUpdate = UVar9;
          goto LAB_00472487;
        }
        goto LAB_004730bd;
      }
      uVar44 = 0;
LAB_004730bd:
      uVar14 = uVar44 & 0xffffffff;
      UVar7 = pZVar3[uVar14].off;
      uVar33 = pZVar3[uVar14].mlen;
      UVar20 = pZVar3[uVar14].litlen;
      local_98 = pZVar3[uVar14].rep[2];
      local_a0 = *(undefined8 *)pZVar3[uVar14].rep;
      src = local_a8;
      uVar25 = (uint)uVar44 - (UVar20 + uVar33);
      iVar62 = pZVar3[uVar14].price;
      if ((uint)uVar44 < UVar20 + uVar33) {
        uVar25 = 0;
      }
    }
LAB_00473110:
    uVar26 = uVar25 + 1;
    pZVar3[uVar26].price = iVar62;
    pZVar3[uVar26].off = UVar7;
    pZVar3[uVar26].mlen = uVar33;
    pZVar3[uVar26].litlen = UVar20;
    *(undefined8 *)pZVar3[uVar26].rep = local_a0;
    pZVar3[uVar26].rep[2] = local_98;
    uVar14 = (ulong)uVar25;
    local_100 = CONCAT44(local_100._4_4_,iVar62);
    pUVar31 = local_108;
    psVar34 = local_b0;
    poVar37 = local_d8;
    if (uVar25 == 0) {
      uVar33 = 1;
      goto LAB_004731e5;
    }
    do {
      uVar33 = uVar25;
      uVar35 = (uint)uVar14;
      uVar22 = pZVar3[uVar14].litlen + pZVar3[uVar14].mlen;
      pZVar15 = pZVar3 + uVar14;
      iVar36 = pZVar15->price;
      UVar8 = pZVar15->off;
      UVar7 = pZVar15->mlen;
      UVar10 = pZVar15->litlen;
      pZVar15 = pZVar3 + uVar14;
      UVar20 = pZVar15->rep[0];
      uVar4 = *(undefined8 *)(&pZVar15->litlen + 2);
      pZVar1 = pZVar3 + uVar33;
      pZVar1->litlen = pZVar15->litlen;
      pZVar1->rep[0] = UVar20;
      *(undefined8 *)(&pZVar1->litlen + 2) = uVar4;
      pZVar15 = pZVar3 + uVar33;
      pZVar15->price = iVar36;
      pZVar15->off = UVar8;
      pZVar15->mlen = UVar7;
      pZVar15->litlen = UVar10;
      uVar14 = (ulong)(uVar35 - uVar22);
      if (uVar22 > uVar35) {
        uVar14 = 0;
      }
      uVar25 = uVar33 - 1;
    } while (uVar22 <= uVar35 && uVar35 - uVar22 != 0);
    for (; uVar33 <= uVar26; uVar33 = uVar33 + 1) {
LAB_004731e5:
      uVar25 = pZVar3[uVar33].litlen;
      uVar14 = (ulong)uVar25;
      UVar20 = pZVar3[uVar33].mlen;
      if (UVar20 == 0) {
        puVar38 = (ulong *)(uVar14 + (long)src);
      }
      else {
        uVar35 = pZVar3[uVar33].off;
        if (uVar35 < 3) {
          uVar22 = (uVar14 == 0) + uVar35;
          if (uVar22 != 0) {
            if (uVar22 == 3) {
              UVar8 = *pUVar31 - 1;
LAB_00473243:
              pUVar31[2] = pUVar31[1];
            }
            else {
              UVar8 = pUVar31[uVar22];
              if (uVar22 != 1) goto LAB_00473243;
            }
            pUVar31[1] = *pUVar31;
            goto LAB_0047324e;
          }
        }
        else {
          *(undefined8 *)(pUVar31 + 1) = *(undefined8 *)pUVar31;
          UVar8 = uVar35 - 2;
LAB_0047324e:
          *pUVar31 = UVar8;
        }
        ZSTD_updateStats(poVar37,uVar25,(BYTE *)src,uVar35,UVar20);
        puVar18 = (ulong *)psVar34->lit;
        puVar38 = (ulong *)((long)puVar18 + uVar14);
        puVar28 = (ulong *)src;
        do {
          *puVar18 = *puVar28;
          puVar18 = puVar18 + 1;
          puVar28 = puVar28 + 1;
        } while (puVar18 < puVar38);
        local_b0->lit = local_b0->lit + uVar14;
        if (uVar25 < 0x10000) {
          psVar17 = local_b0->sequences;
        }
        else {
          local_b0->longLengthID = 1;
          psVar17 = local_b0->sequences;
          local_b0->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)local_b0->sequencesStart) >> 3);
        }
        psVar17->litLength = (U16)uVar25;
        psVar17->offset = uVar35 + 1;
        if (0xffff < UVar20 - 3) {
          local_b0->longLengthID = 2;
          local_b0->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)local_b0->sequencesStart) >> 3);
        }
        psVar17->matchLength = (U16)(UVar20 - 3);
        local_b0->sequences = psVar17 + 1;
        puVar38 = (ulong *)((long)src + (ulong)(UVar20 + uVar25));
        pUVar31 = local_108;
        psVar34 = local_b0;
        poVar37 = local_d8;
        src = puVar38;
      }
    }
    ZSTD_setBasePrices(poVar37,2);
  }
  if (puVar39 <= puVar38) goto LAB_004734cd;
  goto LAB_0046fe9e;
LAB_004723e8:
  local_1e8 = (uint *)&local_140;
  goto LAB_00471c87;
LAB_004723f5:
  local_1f8 = (uint *)&local_140;
LAB_00471c87:
  *local_1e8 = 0;
  *local_1f8 = 0;
LAB_00471f27:
  ms->nextToUpdate = iVar62 - 8;
LAB_00472487:
  if (uVar51 != 0) {
    uVar33 = pZVar2[uVar51 - 1].len;
    if ((local_b4 < uVar33) || (0xfff < uVar33 + iVar36)) {
      UVar8 = 0;
      if (pZVar1->mlen == 0) {
        UVar8 = pZVar1->litlen;
      }
      UVar7 = pZVar2[uVar51 - 1].off;
      src = local_a8;
      uVar25 = iVar36 - UVar8;
      iVar62 = (uint)local_100;
      if (0x1000 < iVar36 - UVar8) {
        uVar25 = 0;
      }
      goto LAB_00473110;
    }
    iVar62 = UVar7 + local_e4;
    pBVar32 = (BYTE *)((long)local_128 + (long)pZVar3);
    uVar53 = 0;
    do {
      UVar7 = pZVar2[uVar53].off;
      rVar70 = ZSTD_updateRep((U32 *)(pBVar32 + 0x10),UVar7,(uint)(UVar8 != 0));
      uVar25 = uVar6;
      if (uVar53 != 0) {
        uVar25 = pZVar2[uVar53 - 1].len + 1;
      }
      uVar33 = pZVar2[uVar53].len;
      if (uVar25 <= uVar33) {
        uVar26 = 0x1f;
        if (UVar7 + 1 != 0) {
          for (; UVar7 + 1 >> uVar26 == 0; uVar26 = uVar26 - 1) {
          }
        }
        do {
          if ((ms->opt).priceType == zop_predef) {
            uVar35 = uVar33 - 2;
            iVar63 = 0x1f;
            if (uVar35 != 0) {
              for (; uVar35 >> iVar63 == 0; iVar63 = iVar63 + -1) {
              }
            }
            iVar63 = (iVar63 + uVar26) * 0x100 + (uVar35 * 0x100 >> ((byte)iVar63 & 0x1f)) + 0x1000;
          }
          else {
            uVar22 = uVar33 - 3;
            uVar35 = (ms->opt).offCodeFreq[uVar26] + 1;
            iVar63 = 0x1f;
            if (uVar35 != 0) {
              for (; uVar35 >> iVar63 == 0; iVar63 = iVar63 + -1) {
              }
            }
            if (uVar22 < 0x80) {
              uVar22 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar22];
            }
            else {
              uVar21 = 0x1f;
              if (uVar22 != 0) {
                for (; uVar22 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                }
              }
              uVar22 = (uVar21 ^ 0xffffffe0) + 0x44;
            }
            uVar21 = (ms->opt).matchLengthFreq[uVar22] + 1;
            iVar64 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> iVar64 == 0; iVar64 = iVar64 + -1) {
              }
            }
            iVar63 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar35 * 0x100 >> ((byte)iVar63 & 0x1f)) +
                     (uVar21 * 0x100 >> ((byte)iVar64 & 0x1f)))) +
                     ((ML_bits[uVar22] + uVar26) - (iVar63 + iVar64)) * 0x100 + 0x33;
          }
          iVar63 = iVar63 + iVar62;
          uVar44 = (ulong)(uVar33 + iVar36);
          if ((uint)uVar14 < uVar33 + iVar36) {
            uVar14 = uVar14 & 0xffffffff;
            pZVar15 = local_88 + uVar14;
            do {
              uVar14 = uVar14 + 1;
              pZVar15->price = 0x40000000;
              pZVar15 = pZVar15 + 1;
            } while (uVar14 < uVar44);
LAB_00472669:
            pZVar3[uVar44].mlen = uVar33;
            pZVar3[uVar44].off = UVar7;
            pZVar3[uVar44].litlen = UVar20;
            pZVar3[uVar44].price = iVar63;
            *(long *)pZVar3[uVar44].rep = rVar70.rep._0_8_;
            pZVar3[uVar44].rep[2] = rVar70.rep[2];
          }
          else if (iVar63 < pZVar3[uVar44].price) goto LAB_00472669;
          uVar33 = uVar33 - 1;
        } while (uVar25 <= uVar33);
      }
      uVar53 = uVar53 + 1;
    } while (uVar53 != uVar51);
  }
LAB_004710f0:
  uVar44 = uVar14;
  uVar53 = (ulong)(iVar36 + 1U);
  if ((uint)uVar14 < iVar36 + 1U) goto LAB_004730bd;
  goto LAB_00470f58;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const current = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (current == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}